

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  long lVar77;
  Geometry *pGVar78;
  long lVar79;
  uint uVar80;
  ulong uVar81;
  byte bVar82;
  float fVar83;
  float fVar84;
  float fVar135;
  float fVar137;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar95 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar141;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined4 uVar142;
  undefined8 uVar143;
  vint4 bi_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar170;
  float fVar171;
  float fVar177;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  float fVar178;
  float fVar179;
  float fVar186;
  float fVar187;
  vint4 ai_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar188;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  vint4 ai_1;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  vint4 ai;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_5fc;
  ulong local_5f8;
  ulong local_5f0;
  Precalculations *local_5e8;
  RTCFilterFunctionNArguments local_5e0;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined4 local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  uint local_584;
  uint local_580;
  Geometry *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined8 local_410;
  undefined8 uStack_408;
  float local_400;
  undefined4 uStack_3fc;
  undefined8 uStack_3f8;
  Primitive *local_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar73 = (ulong)(byte)PVar7;
  lVar26 = uVar73 * 0x25;
  fVar171 = *(float *)(prim + lVar26 + 0x12);
  auVar92 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar26 + 6));
  auVar156._0_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar156._4_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar156._8_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar156._12_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar180._0_4_ = fVar171 * auVar92._0_4_;
  auVar180._4_4_ = fVar171 * auVar92._4_4_;
  auVar180._8_4_ = fVar171 * auVar92._8_4_;
  auVar180._12_4_ = fVar171 * auVar92._12_4_;
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xf + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar73 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1c + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar189._4_4_ = auVar156._0_4_;
  auVar189._0_4_ = auVar156._0_4_;
  auVar189._8_4_ = auVar156._0_4_;
  auVar189._12_4_ = auVar156._0_4_;
  auVar23 = vshufps_avx(auVar156,auVar156,0x55);
  auVar24 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar171 = auVar24._0_4_;
  auVar157._0_4_ = fVar171 * auVar86._0_4_;
  fVar179 = auVar24._4_4_;
  auVar157._4_4_ = fVar179 * auVar86._4_4_;
  fVar170 = auVar24._8_4_;
  auVar157._8_4_ = fVar170 * auVar86._8_4_;
  fVar178 = auVar24._12_4_;
  auVar157._12_4_ = fVar178 * auVar86._12_4_;
  auVar152._0_4_ = auVar87._0_4_ * fVar171;
  auVar152._4_4_ = auVar87._4_4_ * fVar179;
  auVar152._8_4_ = auVar87._8_4_ * fVar170;
  auVar152._12_4_ = auVar87._12_4_ * fVar178;
  auVar95._0_4_ = auVar88._0_4_ * fVar171;
  auVar95._4_4_ = auVar88._4_4_ * fVar179;
  auVar95._8_4_ = auVar88._8_4_ * fVar170;
  auVar95._12_4_ = auVar88._12_4_ * fVar178;
  auVar24 = vfmadd231ps_fma(auVar157,auVar23,auVar92);
  auVar27 = vfmadd231ps_fma(auVar152,auVar23,auVar20);
  auVar23 = vfmadd231ps_fma(auVar95,auVar22,auVar23);
  auVar24 = vfmadd231ps_fma(auVar24,auVar189,auVar93);
  auVar27 = vfmadd231ps_fma(auVar27,auVar189,auVar19);
  auVar28 = vfmadd231ps_fma(auVar23,auVar21,auVar189);
  auVar210._4_4_ = auVar180._0_4_;
  auVar210._0_4_ = auVar180._0_4_;
  auVar210._8_4_ = auVar180._0_4_;
  auVar210._12_4_ = auVar180._0_4_;
  auVar23 = vshufps_avx(auVar180,auVar180,0x55);
  auVar85 = vshufps_avx512vl(auVar180,auVar180,0xaa);
  auVar86 = vmulps_avx512vl(auVar85,auVar86);
  auVar87 = vmulps_avx512vl(auVar85,auVar87);
  auVar88 = vmulps_avx512vl(auVar85,auVar88);
  auVar92 = vfmadd231ps_fma(auVar86,auVar23,auVar92);
  auVar86 = vfmadd231ps_fma(auVar87,auVar23,auVar20);
  auVar20 = vfmadd231ps_fma(auVar88,auVar23,auVar22);
  auVar29 = vfmadd231ps_fma(auVar92,auVar210,auVar93);
  auVar95 = vfmadd231ps_fma(auVar86,auVar210,auVar19);
  auVar202._8_4_ = 0x7fffffff;
  auVar202._0_8_ = 0x7fffffff7fffffff;
  auVar202._12_4_ = 0x7fffffff;
  auVar144 = vfmadd231ps_fma(auVar20,auVar210,auVar21);
  auVar93 = vandps_avx(auVar202,auVar24);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar93,auVar199,1);
  bVar12 = (bool)((byte)uVar81 & 1);
  auVar89._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar24._0_4_;
  bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar24._4_4_;
  bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar24._8_4_;
  bVar12 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar24._12_4_;
  auVar93 = vandps_avx(auVar202,auVar27);
  uVar81 = vcmpps_avx512vl(auVar93,auVar199,1);
  bVar12 = (bool)((byte)uVar81 & 1);
  auVar90._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._0_4_;
  bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._4_4_;
  bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._8_4_;
  bVar12 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._12_4_;
  auVar93 = vandps_avx(auVar202,auVar28);
  uVar81 = vcmpps_avx512vl(auVar93,auVar199,1);
  bVar12 = (bool)((byte)uVar81 & 1);
  auVar91._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._0_4_;
  bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._4_4_;
  bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._8_4_;
  bVar12 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._12_4_;
  auVar92 = vrcp14ps_avx512vl(auVar89);
  auVar200._8_4_ = 0x3f800000;
  auVar200._0_8_ = &DAT_3f8000003f800000;
  auVar200._12_4_ = 0x3f800000;
  auVar93 = vfnmadd213ps_fma(auVar89,auVar92,auVar200);
  auVar28 = vfmadd132ps_fma(auVar93,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar93 = vfnmadd213ps_fma(auVar90,auVar92,auVar200);
  auVar85 = vfmadd132ps_fma(auVar93,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar91);
  auVar93 = vfnmadd213ps_fma(auVar91,auVar92,auVar200);
  auVar94 = vfmadd132ps_fma(auVar93,auVar92,auVar92);
  fVar171 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar197._4_4_ = fVar171;
  auVar197._0_4_ = fVar171;
  auVar197._8_4_ = fVar171;
  auVar197._12_4_ = fVar171;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar93);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar19 = vsubps_avx(auVar92,auVar93);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar92 = vpmovsxwd_avx(auVar86);
  auVar86 = vfmadd213ps_fma(auVar19,auVar197,auVar93);
  auVar93 = vcvtdq2ps_avx(auVar92);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar92 = vpmovsxwd_avx(auVar19);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar93);
  auVar19 = vfmadd213ps_fma(auVar92,auVar197,auVar93);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar93 = vpmovsxwd_avx(auVar20);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar81 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar73 * 2 + uVar81 + 6);
  auVar92 = vpmovsxwd_avx(auVar87);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar93);
  auVar20 = vfmadd213ps_fma(auVar92,auVar197,auVar93);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar93 = vpmovsxwd_avx(auVar21);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar73 * 0x18 + 6);
  auVar92 = vpmovsxwd_avx(auVar22);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar93);
  auVar87 = vfmadd213ps_fma(auVar92,auVar197,auVar93);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar73 * 0x1d + 6);
  auVar93 = vpmovsxwd_avx(auVar88);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar73 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar92 = vpmovsxwd_avx(auVar23);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar93);
  auVar21 = vfmadd213ps_fma(auVar92,auVar197,auVar93);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar73) + 6);
  auVar93 = vpmovsxwd_avx(auVar24);
  auVar93 = vcvtdq2ps_avx(auVar93);
  local_3e8 = prim;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar73 * 0x23 + 6);
  auVar92 = vpmovsxwd_avx(auVar27);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar93);
  auVar92 = vfmadd213ps_fma(auVar92,auVar197,auVar93);
  auVar93 = vsubps_avx(auVar86,auVar29);
  auVar198._0_4_ = auVar28._0_4_ * auVar93._0_4_;
  auVar198._4_4_ = auVar28._4_4_ * auVar93._4_4_;
  auVar198._8_4_ = auVar28._8_4_ * auVar93._8_4_;
  auVar198._12_4_ = auVar28._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar19,auVar29);
  auVar158._0_4_ = auVar28._0_4_ * auVar93._0_4_;
  auVar158._4_4_ = auVar28._4_4_ * auVar93._4_4_;
  auVar158._8_4_ = auVar28._8_4_ * auVar93._8_4_;
  auVar158._12_4_ = auVar28._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar20,auVar95);
  auVar190._0_4_ = auVar85._0_4_ * auVar93._0_4_;
  auVar190._4_4_ = auVar85._4_4_ * auVar93._4_4_;
  auVar190._8_4_ = auVar85._8_4_ * auVar93._8_4_;
  auVar190._12_4_ = auVar85._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar87,auVar95);
  auVar153._0_4_ = auVar85._0_4_ * auVar93._0_4_;
  auVar153._4_4_ = auVar85._4_4_ * auVar93._4_4_;
  auVar153._8_4_ = auVar85._8_4_ * auVar93._8_4_;
  auVar153._12_4_ = auVar85._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar21,auVar144);
  auVar181._0_4_ = auVar94._0_4_ * auVar93._0_4_;
  auVar181._4_4_ = auVar94._4_4_ * auVar93._4_4_;
  auVar181._8_4_ = auVar94._8_4_ * auVar93._8_4_;
  auVar181._12_4_ = auVar94._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar92,auVar144);
  auVar144._0_4_ = auVar94._0_4_ * auVar93._0_4_;
  auVar144._4_4_ = auVar94._4_4_ * auVar93._4_4_;
  auVar144._8_4_ = auVar94._8_4_ * auVar93._8_4_;
  auVar144._12_4_ = auVar94._12_4_ * auVar93._12_4_;
  auVar93 = vpminsd_avx(auVar198,auVar158);
  auVar92 = vpminsd_avx(auVar190,auVar153);
  auVar93 = vmaxps_avx(auVar93,auVar92);
  auVar92 = vpminsd_avx(auVar181,auVar144);
  uVar142 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar28._4_4_ = uVar142;
  auVar28._0_4_ = uVar142;
  auVar28._8_4_ = uVar142;
  auVar28._12_4_ = uVar142;
  auVar92 = vmaxps_avx512vl(auVar92,auVar28);
  auVar93 = vmaxps_avx(auVar93,auVar92);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar93,auVar85);
  auVar93 = vpmaxsd_avx(auVar198,auVar158);
  auVar92 = vpmaxsd_avx(auVar190,auVar153);
  auVar93 = vminps_avx(auVar93,auVar92);
  auVar92 = vpmaxsd_avx(auVar181,auVar144);
  fVar171 = (ray->super_RayK<1>).tfar;
  auVar94._4_4_ = fVar171;
  auVar94._0_4_ = fVar171;
  auVar94._8_4_ = fVar171;
  auVar94._12_4_ = fVar171;
  auVar92 = vminps_avx512vl(auVar92,auVar94);
  auVar93 = vminps_avx(auVar93,auVar92);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar29);
  local_5e8 = pre;
  auVar92 = vpbroadcastd_avx512vl();
  uVar143 = vcmpps_avx512vl(local_170,auVar93,2);
  uVar81 = vpcmpgtd_avx512vl(auVar92,_DAT_01ff0cf0);
  uVar81 = ((byte)uVar143 & 0xf) & uVar81;
  if ((char)uVar81 != '\0') {
    do {
      lVar26 = 0;
      for (uVar73 = uVar81; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar80 = *(uint *)(local_3e8 + 2);
      uVar76 = *(uint *)(local_3e8 + lVar26 * 4 + 6);
      local_5f8 = (ulong)uVar80;
      pGVar78 = (context->scene->geometries).items[uVar80].ptr;
      local_5f0 = (ulong)uVar76;
      uVar73 = (ulong)*(uint *)(*(long *)&pGVar78->field_0x58 +
                               (ulong)uVar76 *
                               pGVar78[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar171 = (pGVar78->time_range).lower;
      fVar171 = pGVar78->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar171) /
                ((pGVar78->time_range).upper - fVar171));
      auVar93 = vroundss_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),9);
      auVar93 = vminss_avx(auVar93,ZEXT416((uint)(pGVar78->fnumTimeSegments + -1.0)));
      auVar93 = vmaxss_avx(ZEXT816(0) << 0x20,auVar93);
      fVar171 = fVar171 - auVar93._0_4_;
      _Var9 = pGVar78[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar77 = (long)(int)auVar93._0_4_ * 0x38;
      lVar26 = *(long *)(_Var9 + 0x10 + lVar77);
      lVar79 = *(long *)(_Var9 + 0x38 + lVar77);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar77);
      auVar154._4_4_ = fVar171;
      auVar154._0_4_ = fVar171;
      auVar154._8_4_ = fVar171;
      auVar154._12_4_ = fVar171;
      pfVar3 = (float *)(lVar79 + uVar73 * lVar10);
      auVar203._0_4_ = fVar171 * *pfVar3;
      auVar203._4_4_ = fVar171 * pfVar3[1];
      auVar203._8_4_ = fVar171 * pfVar3[2];
      auVar203._12_4_ = fVar171 * pfVar3[3];
      pfVar3 = (float *)(lVar79 + (uVar73 + 1) * lVar10);
      auVar204._0_4_ = fVar171 * *pfVar3;
      auVar204._4_4_ = fVar171 * pfVar3[1];
      auVar204._8_4_ = fVar171 * pfVar3[2];
      auVar204._12_4_ = fVar171 * pfVar3[3];
      auVar93 = vmulps_avx512vl(auVar154,*(undefined1 (*) [16])(lVar79 + (uVar73 + 2) * lVar10));
      auVar92 = vmulps_avx512vl(auVar154,*(undefined1 (*) [16])(lVar79 + lVar10 * (uVar73 + 3)));
      lVar79 = *(long *)(_Var9 + lVar77);
      fVar171 = 1.0 - fVar171;
      auVar145._4_4_ = fVar171;
      auVar145._0_4_ = fVar171;
      auVar145._8_4_ = fVar171;
      auVar145._12_4_ = fVar171;
      local_5b0 = vfmadd231ps_fma(auVar203,auVar145,*(undefined1 (*) [16])(lVar79 + lVar26 * uVar73)
                                 );
      local_4f0 = vfmadd231ps_fma(auVar204,auVar145,
                                  *(undefined1 (*) [16])(lVar79 + lVar26 * (uVar73 + 1)));
      local_500 = vfmadd231ps_avx512vl
                            (auVar93,auVar145,*(undefined1 (*) [16])(lVar79 + lVar26 * (uVar73 + 2))
                            );
      _local_510 = vfmadd231ps_avx512vl
                             (auVar92,auVar145,
                              *(undefined1 (*) [16])(lVar79 + lVar26 * (uVar73 + 3)));
      iVar8 = (int)pGVar78[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar26 = (long)iVar8 * 0x44;
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar92 = vsubps_avx(local_5b0,(undefined1  [16])aVar4);
      uVar142 = auVar92._0_4_;
      auVar159._4_4_ = uVar142;
      auVar159._0_4_ = uVar142;
      auVar159._8_4_ = uVar142;
      auVar159._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar92,auVar92,0x55);
      aVar5 = (local_5e8->ray_space).vx.field_0;
      aVar6 = (local_5e8->ray_space).vy.field_0;
      fVar171 = (local_5e8->ray_space).vz.field_0.m128[0];
      fVar179 = (local_5e8->ray_space).vz.field_0.m128[1];
      fVar170 = (local_5e8->ray_space).vz.field_0.m128[2];
      fVar178 = (local_5e8->ray_space).vz.field_0.m128[3];
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar206._0_4_ = auVar92._0_4_ * fVar171;
      auVar206._4_4_ = auVar92._4_4_ * fVar179;
      auVar206._8_4_ = auVar92._8_4_ * fVar170;
      auVar206._12_4_ = auVar92._12_4_ * fVar178;
      auVar93 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar6,auVar93);
      auVar86 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar159);
      auVar92 = vsubps_avx(local_4f0,(undefined1  [16])aVar4);
      uVar142 = auVar92._0_4_;
      auVar160._4_4_ = uVar142;
      auVar160._0_4_ = uVar142;
      auVar160._8_4_ = uVar142;
      auVar160._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar207._0_4_ = auVar92._0_4_ * fVar171;
      auVar207._4_4_ = auVar92._4_4_ * fVar179;
      auVar207._8_4_ = auVar92._8_4_ * fVar170;
      auVar207._12_4_ = auVar92._12_4_ * fVar178;
      auVar93 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar6,auVar93);
      auVar19 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar160);
      auVar92 = vsubps_avx512vl(local_500,(undefined1  [16])aVar4);
      uVar142 = auVar92._0_4_;
      auVar161._4_4_ = uVar142;
      auVar161._0_4_ = uVar142;
      auVar161._8_4_ = uVar142;
      auVar161._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar208._0_4_ = auVar92._0_4_ * fVar171;
      auVar208._4_4_ = auVar92._4_4_ * fVar179;
      auVar208._8_4_ = auVar92._8_4_ * fVar170;
      auVar208._12_4_ = auVar92._12_4_ * fVar178;
      auVar93 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar6,auVar93);
      auVar20 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar161);
      auVar92 = vsubps_avx512vl(_local_510,(undefined1  [16])aVar4);
      uVar142 = auVar92._0_4_;
      auVar155._4_4_ = uVar142;
      auVar155._0_4_ = uVar142;
      auVar155._8_4_ = uVar142;
      auVar155._12_4_ = uVar142;
      auVar93 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar212._0_4_ = auVar92._0_4_ * fVar171;
      auVar212._4_4_ = auVar92._4_4_ * fVar179;
      auVar212._8_4_ = auVar92._8_4_ * fVar170;
      auVar212._12_4_ = auVar92._12_4_ * fVar178;
      auVar93 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar6,auVar93);
      auVar87 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar155);
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar26);
      uVar142 = auVar86._0_4_;
      local_360._4_4_ = uVar142;
      local_360._0_4_ = uVar142;
      local_360._8_4_ = uVar142;
      local_360._12_4_ = uVar142;
      local_360._16_4_ = uVar142;
      local_360._20_4_ = uVar142;
      local_360._24_4_ = uVar142;
      local_360._28_4_ = uVar142;
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x484);
      auVar96._8_4_ = 1;
      auVar96._0_8_ = 0x100000001;
      auVar96._12_4_ = 1;
      auVar96._16_4_ = 1;
      auVar96._20_4_ = 1;
      auVar96._24_4_ = 1;
      auVar96._28_4_ = 1;
      local_340 = vpermps_avx2(auVar96,ZEXT1632(auVar86));
      local_380 = vbroadcastss_avx512vl(auVar19);
      local_540 = vpermps_avx512vl(auVar96,ZEXT1632(auVar19));
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x908);
      local_560 = vbroadcastss_avx512vl(auVar20);
      local_460 = vpermps_avx512vl(auVar96,ZEXT1632(auVar20));
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0xd8c);
      local_480 = vbroadcastss_avx512vl(auVar87);
      auVar223 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar87));
      auVar224 = ZEXT3264(local_4a0);
      auVar96 = vmulps_avx512vl(local_480,auVar108);
      auVar97 = vmulps_avx512vl(local_4a0,auVar108);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_560);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,local_460);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,local_380);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar113,local_540);
      auVar99 = vfmadd231ps_avx512vl(auVar96,auVar111,local_360);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar26);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x484);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x908);
      auVar100 = vfmadd231ps_avx512vl(auVar98,auVar111,local_340);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0xd8c);
      auVar101 = vmulps_avx512vl(local_480,auVar98);
      auVar102 = vmulps_avx512vl(local_4a0,auVar98);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_560);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_460);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_380);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_540);
      auVar21 = vfmadd231ps_fma(auVar101,auVar96,local_360);
      auVar22 = vfmadd231ps_fma(auVar102,auVar96,local_340);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar21),auVar99);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar22),auVar100);
      auVar101 = vmulps_avx512vl(auVar100,auVar102);
      auVar104 = vmulps_avx512vl(auVar99,auVar103);
      auVar101 = vsubps_avx512vl(auVar101,auVar104);
      auVar93 = vshufps_avx(local_5b0,local_5b0,0xff);
      uVar143 = auVar93._0_8_;
      local_80._8_8_ = uVar143;
      local_80._0_8_ = uVar143;
      local_80._16_8_ = uVar143;
      local_80._24_8_ = uVar143;
      auVar93 = vshufps_avx(local_4f0,local_4f0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(local_500,local_500,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(_local_510,_local_510,0xff);
      uVar143 = auVar93._0_8_;
      register0x00001248 = uVar143;
      local_e0 = uVar143;
      register0x00001250 = uVar143;
      register0x00001258 = uVar143;
      auVar104 = vmulps_avx512vl(_local_e0,auVar108);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_a0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_80);
      auVar105 = vmulps_avx512vl(_local_e0,auVar98);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,local_a0);
      auVar88 = vfmadd231ps_fma(auVar105,auVar96,local_80);
      auVar105 = vmulps_avx512vl(auVar103,auVar103);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar102);
      auVar106 = vmaxps_avx512vl(auVar104,ZEXT1632(auVar88));
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      auVar105 = vmulps_avx512vl(auVar106,auVar105);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar143 = vcmpps_avx512vl(auVar101,auVar105,2);
      auVar23 = local_5b0;
      auVar93 = vblendps_avx(auVar86,local_5b0,8);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar92 = vandps_avx512vl(auVar93,auVar85);
      auVar28 = local_4f0;
      auVar93 = vblendps_avx(auVar19,local_4f0,8);
      auVar93 = vandps_avx512vl(auVar93,auVar85);
      auVar92 = vmaxps_avx(auVar92,auVar93);
      auVar27 = local_500;
      auVar93 = vblendps_avx(auVar20,local_500,8);
      auVar94 = vandps_avx512vl(auVar93,auVar85);
      auVar24 = _local_510;
      auVar93 = vblendps_avx(auVar87,_local_510,8);
      auVar93 = vandps_avx512vl(auVar93,auVar85);
      auVar93 = vmaxps_avx(auVar94,auVar93);
      auVar93 = vmaxps_avx(auVar92,auVar93);
      auVar92 = vmovshdup_avx(auVar93);
      auVar92 = vmaxss_avx(auVar92,auVar93);
      auVar93 = vshufpd_avx(auVar93,auVar93,1);
      auVar93 = vmaxss_avx(auVar93,auVar92);
      _local_300 = vcvtsi2ss_avx512f(_local_510,iVar8);
      auVar105._0_4_ = local_300._0_4_;
      auVar105._4_4_ = auVar105._0_4_;
      auVar105._8_4_ = auVar105._0_4_;
      auVar105._12_4_ = auVar105._0_4_;
      auVar105._16_4_ = auVar105._0_4_;
      auVar105._20_4_ = auVar105._0_4_;
      auVar105._24_4_ = auVar105._0_4_;
      auVar105._28_4_ = auVar105._0_4_;
      uVar25 = vcmpps_avx512vl(auVar105,_DAT_02020f40,0xe);
      bVar82 = (byte)uVar143 & (byte)uVar25;
      fVar179 = auVar93._0_4_ * 4.7683716e-07;
      auVar101._8_4_ = 2;
      auVar101._0_8_ = 0x200000002;
      auVar101._12_4_ = 2;
      auVar101._16_4_ = 2;
      auVar101._20_4_ = 2;
      auVar101._24_4_ = 2;
      auVar101._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar101,ZEXT1632(auVar86));
      local_120 = vpermps_avx512vl(auVar101,ZEXT1632(auVar19));
      local_140 = vpermps_avx512vl(auVar101,ZEXT1632(auVar20));
      auVar101 = vpermps_avx2(auVar101,ZEXT1632(auVar87));
      fVar171 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar93 = auVar103._0_16_;
      _local_520 = ZEXT416((uint)fVar179);
      if (bVar82 == 0) {
        auVar93 = vxorps_avx512vl(auVar93,auVar93);
        auVar221 = ZEXT1664(auVar93);
        auVar218 = ZEXT3264(local_360);
        auVar219 = ZEXT3264(local_340);
        auVar220 = ZEXT3264(local_380);
        auVar216 = ZEXT3264(local_540);
        auVar215 = ZEXT3264(local_560);
        auVar222 = ZEXT3264(local_460);
        local_5b0 = auVar23;
        _local_510 = auVar24;
      }
      else {
        local_3e0 = fVar171;
        fStack_3dc = 0.0;
        fStack_3d8 = 0.0;
        fStack_3d4 = 0.0;
        auVar98 = vmulps_avx512vl(auVar101,auVar98);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar98);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar107);
        auVar106 = vfmadd213ps_avx512vl(auVar96,local_100,auVar97);
        auVar108 = vmulps_avx512vl(auVar101,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar108);
        auVar97 = vfmadd213ps_avx512vl(auVar113,local_120,auVar109);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1694);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1f9c);
        auVar110 = vfmadd213ps_avx512vl(auVar111,local_100,auVar97);
        auVar111 = vmulps_avx512vl(local_480,auVar96);
        auVar97 = vmulps_avx512vl(local_4a0,auVar96);
        auVar209._0_4_ = auVar101._0_4_ * auVar96._0_4_;
        auVar209._4_4_ = auVar101._4_4_ * auVar96._4_4_;
        auVar209._8_4_ = auVar101._8_4_ * auVar96._8_4_;
        auVar209._12_4_ = auVar101._12_4_ * auVar96._12_4_;
        auVar209._16_4_ = auVar101._16_4_ * auVar96._16_4_;
        auVar209._20_4_ = auVar101._20_4_ * auVar96._20_4_;
        auVar209._24_4_ = auVar101._24_4_ * auVar96._24_4_;
        auVar209._28_4_ = 0;
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_560);
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar108,local_460);
        auVar108 = vfmadd231ps_avx512vl(auVar209,local_140,auVar108);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,local_380);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_540);
        auVar97 = vfmadd231ps_avx512vl(auVar108,local_120,auVar109);
        auVar107 = vfmadd231ps_avx512vl(auVar111,auVar113,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,local_340);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1f9c);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_100,auVar113);
        auVar98 = vmulps_avx512vl(local_480,auVar108);
        auVar112 = vmulps_avx512vl(local_4a0,auVar108);
        local_3c0 = auVar101;
        auVar113._4_4_ = auVar101._4_4_ * auVar108._4_4_;
        auVar113._0_4_ = auVar101._0_4_ * auVar108._0_4_;
        auVar113._8_4_ = auVar101._8_4_ * auVar108._8_4_;
        auVar113._12_4_ = auVar101._12_4_ * auVar108._12_4_;
        auVar113._16_4_ = auVar101._16_4_ * auVar108._16_4_;
        auVar113._20_4_ = auVar101._20_4_ * auVar108._20_4_;
        auVar113._24_4_ = auVar101._24_4_ * auVar108._24_4_;
        auVar113._28_4_ = auVar108._28_4_;
        auVar108 = vfmadd231ps_avx512vl(auVar98,auVar109,local_560);
        auVar98 = vfmadd231ps_avx512vl(auVar112,auVar109,local_460);
        auVar109 = vfmadd231ps_avx512vl(auVar113,local_140,auVar109);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1694);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar113,local_540);
        auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
        auVar109 = vfmadd231ps_avx512vl(auVar108,auVar111,local_360);
        auVar108 = vfmadd231ps_avx512vl(auVar98,auVar111,local_340);
        auVar98 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
        auVar213._8_4_ = 0x7fffffff;
        auVar213._0_8_ = 0x7fffffff7fffffff;
        auVar213._12_4_ = 0x7fffffff;
        auVar213._16_4_ = 0x7fffffff;
        auVar213._20_4_ = 0x7fffffff;
        auVar213._24_4_ = 0x7fffffff;
        auVar213._28_4_ = 0x7fffffff;
        auVar111 = vandps_avx(auVar107,auVar213);
        auVar113 = vandps_avx(auVar96,auVar213);
        auVar113 = vmaxps_avx(auVar111,auVar113);
        auVar111 = vandps_avx(auVar97,auVar213);
        auVar111 = vmaxps_avx(auVar113,auVar111);
        auVar97 = vbroadcastss_avx512vl(_local_520);
        uVar73 = vcmpps_avx512vl(auVar111,auVar97,1);
        bVar12 = (bool)((byte)uVar73 & 1);
        auVar112._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar107._0_4_);
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar107._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar107._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar107._12_4_);
        bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar107._16_4_);
        bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar107._20_4_);
        bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar107._24_4_);
        bVar12 = SUB81(uVar73 >> 7,0);
        auVar112._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar107._28_4_;
        bVar12 = (bool)((byte)uVar73 & 1);
        auVar114._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar96._0_4_);
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar96._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar96._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar96._12_4_);
        bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar96._16_4_);
        bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar96._20_4_);
        bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar96._24_4_);
        bVar12 = SUB81(uVar73 >> 7,0);
        auVar114._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar96._28_4_;
        auVar111 = vandps_avx(auVar213,auVar109);
        auVar113 = vandps_avx(auVar108,auVar213);
        auVar113 = vmaxps_avx(auVar111,auVar113);
        auVar111 = vandps_avx(auVar98,auVar213);
        auVar111 = vmaxps_avx(auVar113,auVar111);
        uVar73 = vcmpps_avx512vl(auVar111,auVar97,1);
        bVar12 = (bool)((byte)uVar73 & 1);
        auVar115._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar109._0_4_);
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar109._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar109._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar109._12_4_);
        bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar109._16_4_);
        bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar109._20_4_);
        bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar109._24_4_);
        bVar12 = SUB81(uVar73 >> 7,0);
        auVar115._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar109._28_4_;
        bVar12 = (bool)((byte)uVar73 & 1);
        auVar116._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar108._0_4_);
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar108._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar108._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar108._12_4_);
        bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar108._16_4_);
        bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar108._20_4_);
        bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar108._24_4_);
        bVar12 = SUB81(uVar73 >> 7,0);
        auVar116._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar108._28_4_;
        auVar95 = vxorps_avx512vl(auVar93,auVar93);
        auVar221 = ZEXT1664(auVar95);
        auVar111 = vfmadd213ps_avx512vl(auVar112,auVar112,ZEXT1632(auVar95));
        auVar93 = vfmadd231ps_fma(auVar111,auVar114,auVar114);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar170 = auVar113._0_4_;
        fVar178 = auVar113._4_4_;
        fVar186 = auVar113._8_4_;
        fVar187 = auVar113._12_4_;
        fVar188 = auVar113._16_4_;
        fVar177 = auVar113._20_4_;
        fVar83 = auVar113._24_4_;
        auVar111._4_4_ = fVar178 * fVar178 * fVar178 * auVar93._4_4_ * -0.5;
        auVar111._0_4_ = fVar170 * fVar170 * fVar170 * auVar93._0_4_ * -0.5;
        auVar111._8_4_ = fVar186 * fVar186 * fVar186 * auVar93._8_4_ * -0.5;
        auVar111._12_4_ = fVar187 * fVar187 * fVar187 * auVar93._12_4_ * -0.5;
        auVar111._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar111._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
        auVar111._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar111._28_4_ = auVar98._28_4_;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar113);
        auVar109._4_4_ = auVar114._4_4_ * auVar111._4_4_;
        auVar109._0_4_ = auVar114._0_4_ * auVar111._0_4_;
        auVar109._8_4_ = auVar114._8_4_ * auVar111._8_4_;
        auVar109._12_4_ = auVar114._12_4_ * auVar111._12_4_;
        auVar109._16_4_ = auVar114._16_4_ * auVar111._16_4_;
        auVar109._20_4_ = auVar114._20_4_ * auVar111._20_4_;
        auVar109._24_4_ = auVar114._24_4_ * auVar111._24_4_;
        auVar109._28_4_ = 0;
        auVar108._4_4_ = auVar111._4_4_ * -auVar112._4_4_;
        auVar108._0_4_ = auVar111._0_4_ * -auVar112._0_4_;
        auVar108._8_4_ = auVar111._8_4_ * -auVar112._8_4_;
        auVar108._12_4_ = auVar111._12_4_ * -auVar112._12_4_;
        auVar108._16_4_ = auVar111._16_4_ * -auVar112._16_4_;
        auVar108._20_4_ = auVar111._20_4_ * -auVar112._20_4_;
        auVar108._24_4_ = auVar111._24_4_ * -auVar112._24_4_;
        auVar108._28_4_ = auVar114._28_4_;
        auVar111 = vmulps_avx512vl(auVar111,ZEXT1632(auVar95));
        auVar102 = ZEXT1632(auVar95);
        auVar113 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar102);
        auVar93 = vfmadd231ps_fma(auVar113,auVar116,auVar116);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar170 = auVar113._0_4_;
        fVar178 = auVar113._4_4_;
        fVar186 = auVar113._8_4_;
        fVar187 = auVar113._12_4_;
        fVar188 = auVar113._16_4_;
        fVar177 = auVar113._20_4_;
        fVar83 = auVar113._24_4_;
        auVar97._4_4_ = fVar178 * fVar178 * fVar178 * auVar93._4_4_ * -0.5;
        auVar97._0_4_ = fVar170 * fVar170 * fVar170 * auVar93._0_4_ * -0.5;
        auVar97._8_4_ = fVar186 * fVar186 * fVar186 * auVar93._8_4_ * -0.5;
        auVar97._12_4_ = fVar187 * fVar187 * fVar187 * auVar93._12_4_ * -0.5;
        auVar97._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar97._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
        auVar97._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar97._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar113);
        auVar107._4_4_ = auVar116._4_4_ * auVar96._4_4_;
        auVar107._0_4_ = auVar116._0_4_ * auVar96._0_4_;
        auVar107._8_4_ = auVar116._8_4_ * auVar96._8_4_;
        auVar107._12_4_ = auVar116._12_4_ * auVar96._12_4_;
        auVar107._16_4_ = auVar116._16_4_ * auVar96._16_4_;
        auVar107._20_4_ = auVar116._20_4_ * auVar96._20_4_;
        auVar107._24_4_ = auVar116._24_4_ * auVar96._24_4_;
        auVar107._28_4_ = auVar113._28_4_;
        auVar98._4_4_ = -auVar115._4_4_ * auVar96._4_4_;
        auVar98._0_4_ = -auVar115._0_4_ * auVar96._0_4_;
        auVar98._8_4_ = -auVar115._8_4_ * auVar96._8_4_;
        auVar98._12_4_ = -auVar115._12_4_ * auVar96._12_4_;
        auVar98._16_4_ = -auVar115._16_4_ * auVar96._16_4_;
        auVar98._20_4_ = -auVar115._20_4_ * auVar96._20_4_;
        auVar98._24_4_ = -auVar115._24_4_ * auVar96._24_4_;
        auVar98._28_4_ = auVar115._28_4_ ^ 0x80000000;
        auVar113 = vmulps_avx512vl(auVar96,auVar102);
        auVar93 = vfmadd213ps_fma(auVar109,auVar104,auVar99);
        auVar92 = vfmadd213ps_fma(auVar108,auVar104,auVar100);
        auVar96 = vfmadd213ps_avx512vl(auVar111,auVar104,auVar110);
        auVar97 = vfmadd213ps_avx512vl(auVar107,ZEXT1632(auVar88),ZEXT1632(auVar21));
        auVar85 = vfnmadd213ps_fma(auVar109,auVar104,auVar99);
        auVar99 = ZEXT1632(auVar88);
        auVar86 = vfmadd213ps_fma(auVar98,auVar99,ZEXT1632(auVar22));
        auVar94 = vfnmadd213ps_fma(auVar108,auVar104,auVar100);
        auVar19 = vfmadd213ps_fma(auVar113,auVar99,auVar106);
        auVar109 = vfnmadd231ps_avx512vl(auVar110,auVar104,auVar111);
        auVar21 = vfnmadd213ps_fma(auVar107,auVar99,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar98,auVar99,ZEXT1632(auVar22));
        auVar29 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar88),auVar113);
        auVar113 = vsubps_avx512vl(auVar97,ZEXT1632(auVar85));
        auVar111 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar94));
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar19),auVar109);
        auVar107 = vmulps_avx512vl(auVar111,auVar109);
        auVar20 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar94),auVar108);
        auVar99._4_4_ = auVar85._4_4_ * auVar108._4_4_;
        auVar99._0_4_ = auVar85._0_4_ * auVar108._0_4_;
        auVar99._8_4_ = auVar85._8_4_ * auVar108._8_4_;
        auVar99._12_4_ = auVar85._12_4_ * auVar108._12_4_;
        auVar99._16_4_ = auVar108._16_4_ * 0.0;
        auVar99._20_4_ = auVar108._20_4_ * 0.0;
        auVar99._24_4_ = auVar108._24_4_ * 0.0;
        auVar99._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar99,auVar109,auVar113);
        auVar100._4_4_ = auVar94._4_4_ * auVar113._4_4_;
        auVar100._0_4_ = auVar94._0_4_ * auVar113._0_4_;
        auVar100._8_4_ = auVar94._8_4_ * auVar113._8_4_;
        auVar100._12_4_ = auVar94._12_4_ * auVar113._12_4_;
        auVar100._16_4_ = auVar113._16_4_ * 0.0;
        auVar100._20_4_ = auVar113._20_4_ * 0.0;
        auVar100._24_4_ = auVar113._24_4_ * 0.0;
        auVar100._28_4_ = auVar113._28_4_;
        auVar87 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar85),auVar111);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar102,auVar108);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,ZEXT1632(auVar20));
        auVar112 = ZEXT1632(auVar95);
        uVar73 = vcmpps_avx512vl(auVar111,auVar112,2);
        bVar72 = (byte)uVar73;
        fVar83 = (float)((uint)(bVar72 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar21._0_4_);
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar135 = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar21._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar137 = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar21._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar139 = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar21._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar83))));
        fVar84 = (float)((uint)(bVar72 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar22._0_4_);
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        fVar136 = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar22._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        fVar138 = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar22._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        fVar140 = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar22._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar84))));
        auVar110._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar29._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar29._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar29._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar29._12_4_);
        fVar178 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar96._16_4_);
        auVar110._16_4_ = fVar178;
        fVar170 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar96._20_4_);
        auVar110._20_4_ = fVar170;
        fVar186 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar96._24_4_);
        auVar110._24_4_ = fVar186;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar96._28_4_;
        auVar110._28_4_ = iVar1;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar85),auVar97);
        auVar117._0_4_ =
             (uint)(bVar72 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar20._0_4_;
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar20._4_4_;
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar20._8_4_;
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar20._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar113._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar113._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar113._24_4_;
        auVar117._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar86));
        auVar118._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar92._0_4_
                    );
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar92._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar92._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar92._12_4_);
        fVar187 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar113._16_4_);
        auVar118._16_4_ = fVar187;
        fVar188 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar113._20_4_);
        auVar118._20_4_ = fVar188;
        fVar177 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar113._24_4_);
        auVar118._24_4_ = fVar177;
        auVar118._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar19));
        auVar119._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar96._0_4_
                    );
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar96._4_4_);
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar96._8_4_);
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar96._12_4_);
        bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar12 * auVar113._16_4_ | (uint)!bVar12 * auVar96._16_4_);
        bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar12 * auVar113._20_4_ | (uint)!bVar12 * auVar96._20_4_);
        bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar12 * auVar113._24_4_ | (uint)!bVar12 * auVar96._24_4_);
        bVar12 = SUB81(uVar73 >> 7,0);
        auVar119._28_4_ = (uint)bVar12 * auVar113._28_4_ | (uint)!bVar12 * auVar96._28_4_;
        auVar120._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar85._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar97._0_4_;
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar12 * (int)auVar85._4_4_ | (uint)!bVar12 * auVar97._4_4_;
        bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar12 * (int)auVar85._8_4_ | (uint)!bVar12 * auVar97._8_4_;
        bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar12 * (int)auVar85._12_4_ | (uint)!bVar12 * auVar97._12_4_;
        auVar120._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar97._16_4_;
        auVar120._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar97._20_4_;
        auVar120._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar97._24_4_;
        auVar120._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar97._28_4_;
        bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar121._0_4_ =
             (uint)(bVar72 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar19._0_4_;
        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar19._4_4_;
        bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar19._8_4_;
        bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar19._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar109._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar109._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar109._24_4_;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar109._28_4_;
        auVar121._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar120,auVar107);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar94._12_4_ |
                                                 (uint)!bVar15 * auVar86._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar94._8_4_ |
                                                          (uint)!bVar14 * auVar86._8_4_,
                                                          CONCAT44((uint)bVar12 * (int)auVar94._4_4_
                                                                   | (uint)!bVar12 * auVar86._4_4_,
                                                                   (uint)(bVar72 & 1) *
                                                                   (int)auVar94._0_4_ |
                                                                   (uint)!(bool)(bVar72 & 1) *
                                                                   auVar86._0_4_)))),auVar98);
        auVar109 = vsubps_avx(auVar121,auVar110);
        auVar108 = vsubps_avx(auVar107,auVar117);
        auVar96 = vsubps_avx(auVar98,auVar118);
        auVar97 = vsubps_avx(auVar110,auVar119);
        auVar102._4_4_ = auVar109._4_4_ * fVar135;
        auVar102._0_4_ = auVar109._0_4_ * fVar83;
        auVar102._8_4_ = auVar109._8_4_ * fVar137;
        auVar102._12_4_ = auVar109._12_4_ * fVar139;
        auVar102._16_4_ = auVar109._16_4_ * 0.0;
        auVar102._20_4_ = auVar109._20_4_ * 0.0;
        auVar102._24_4_ = auVar109._24_4_ * 0.0;
        auVar102._28_4_ = iVar2;
        auVar93 = vfmsub231ps_fma(auVar102,auVar110,auVar99);
        auVar103._4_4_ = fVar136 * auVar99._4_4_;
        auVar103._0_4_ = fVar84 * auVar99._0_4_;
        auVar103._8_4_ = fVar138 * auVar99._8_4_;
        auVar103._12_4_ = fVar140 * auVar99._12_4_;
        auVar103._16_4_ = auVar99._16_4_ * 0.0;
        auVar103._20_4_ = auVar99._20_4_ * 0.0;
        auVar103._24_4_ = auVar99._24_4_ * 0.0;
        auVar103._28_4_ = auVar111._28_4_;
        auVar92 = vfmsub231ps_fma(auVar103,auVar107,auVar113);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar112,ZEXT1632(auVar93));
        auVar182._0_4_ = auVar113._0_4_ * auVar110._0_4_;
        auVar182._4_4_ = auVar113._4_4_ * auVar110._4_4_;
        auVar182._8_4_ = auVar113._8_4_ * auVar110._8_4_;
        auVar182._12_4_ = auVar113._12_4_ * auVar110._12_4_;
        auVar182._16_4_ = auVar113._16_4_ * fVar178;
        auVar182._20_4_ = auVar113._20_4_ * fVar170;
        auVar182._24_4_ = auVar113._24_4_ * fVar186;
        auVar182._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar182,auVar98,auVar109);
        auVar100 = vfmadd231ps_avx512vl(auVar111,auVar112,ZEXT1632(auVar93));
        auVar111 = vmulps_avx512vl(auVar97,auVar117);
        auVar111 = vfmsub231ps_avx512vl(auVar111,auVar108,auVar119);
        auVar106._4_4_ = auVar96._4_4_ * auVar119._4_4_;
        auVar106._0_4_ = auVar96._0_4_ * auVar119._0_4_;
        auVar106._8_4_ = auVar96._8_4_ * auVar119._8_4_;
        auVar106._12_4_ = auVar96._12_4_ * auVar119._12_4_;
        auVar106._16_4_ = auVar96._16_4_ * auVar119._16_4_;
        auVar106._20_4_ = auVar96._20_4_ * auVar119._20_4_;
        auVar106._24_4_ = auVar96._24_4_ * auVar119._24_4_;
        auVar106._28_4_ = auVar119._28_4_;
        auVar93 = vfmsub231ps_fma(auVar106,auVar118,auVar97);
        auVar183._0_4_ = auVar118._0_4_ * auVar108._0_4_;
        auVar183._4_4_ = auVar118._4_4_ * auVar108._4_4_;
        auVar183._8_4_ = auVar118._8_4_ * auVar108._8_4_;
        auVar183._12_4_ = auVar118._12_4_ * auVar108._12_4_;
        auVar183._16_4_ = fVar187 * auVar108._16_4_;
        auVar183._20_4_ = fVar188 * auVar108._20_4_;
        auVar183._24_4_ = fVar177 * auVar108._24_4_;
        auVar183._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar183,auVar96,auVar117);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar112,auVar111);
        auVar102 = vfmadd231ps_avx512vl(auVar111,auVar112,ZEXT1632(auVar93));
        auVar111 = vmaxps_avx(auVar100,auVar102);
        uVar143 = vcmpps_avx512vl(auVar111,auVar112,2);
        bVar82 = bVar82 & (byte)uVar143;
        auVar218 = ZEXT3264(local_360);
        auVar219 = ZEXT3264(local_340);
        auVar220 = ZEXT3264(local_380);
        auVar216 = ZEXT3264(local_540);
        auVar215 = ZEXT3264(local_560);
        auVar211 = ZEXT1664(_local_520);
        if (bVar82 == 0) {
          bVar82 = 0;
        }
        else {
          auVar40._4_4_ = auVar97._4_4_ * auVar113._4_4_;
          auVar40._0_4_ = auVar97._0_4_ * auVar113._0_4_;
          auVar40._8_4_ = auVar97._8_4_ * auVar113._8_4_;
          auVar40._12_4_ = auVar97._12_4_ * auVar113._12_4_;
          auVar40._16_4_ = auVar97._16_4_ * auVar113._16_4_;
          auVar40._20_4_ = auVar97._20_4_ * auVar113._20_4_;
          auVar40._24_4_ = auVar97._24_4_ * auVar113._24_4_;
          auVar40._28_4_ = auVar111._28_4_;
          auVar86 = vfmsub231ps_fma(auVar40,auVar96,auVar109);
          auVar41._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar41._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar41._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar41._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar41._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar41._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar41._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar41._28_4_ = auVar109._28_4_;
          auVar92 = vfmsub231ps_fma(auVar41,auVar99,auVar97);
          auVar42._4_4_ = auVar96._4_4_ * auVar99._4_4_;
          auVar42._0_4_ = auVar96._0_4_ * auVar99._0_4_;
          auVar42._8_4_ = auVar96._8_4_ * auVar99._8_4_;
          auVar42._12_4_ = auVar96._12_4_ * auVar99._12_4_;
          auVar42._16_4_ = auVar96._16_4_ * auVar99._16_4_;
          auVar42._20_4_ = auVar96._20_4_ * auVar99._20_4_;
          auVar42._24_4_ = auVar96._24_4_ * auVar99._24_4_;
          auVar42._28_4_ = auVar96._28_4_;
          auVar19 = vfmsub231ps_fma(auVar42,auVar108,auVar113);
          auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar19));
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar86),auVar112);
          auVar113 = vrcp14ps_avx512vl(auVar111);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = &DAT_3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar31._16_4_ = 0x3f800000;
          auVar31._20_4_ = 0x3f800000;
          auVar31._24_4_ = 0x3f800000;
          auVar31._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar113,auVar111,auVar31);
          auVar93 = vfmadd132ps_fma(auVar109,auVar113,auVar113);
          auVar43._4_4_ = auVar19._4_4_ * auVar110._4_4_;
          auVar43._0_4_ = auVar19._0_4_ * auVar110._0_4_;
          auVar43._8_4_ = auVar19._8_4_ * auVar110._8_4_;
          auVar43._12_4_ = auVar19._12_4_ * auVar110._12_4_;
          auVar43._16_4_ = fVar178 * 0.0;
          auVar43._20_4_ = fVar170 * 0.0;
          auVar43._24_4_ = fVar186 * 0.0;
          auVar43._28_4_ = iVar1;
          auVar92 = vfmadd231ps_fma(auVar43,auVar98,ZEXT1632(auVar92));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar107,ZEXT1632(auVar86));
          fVar178 = auVar93._0_4_;
          fVar186 = auVar93._4_4_;
          fVar187 = auVar93._8_4_;
          fVar188 = auVar93._12_4_;
          auVar113 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar188,
                                        CONCAT48(auVar92._8_4_ * fVar187,
                                                 CONCAT44(auVar92._4_4_ * fVar186,
                                                          auVar92._0_4_ * fVar178))));
          auVar201._4_4_ = fVar171;
          auVar201._0_4_ = fVar171;
          auVar201._8_4_ = fVar171;
          auVar201._12_4_ = fVar171;
          auVar201._16_4_ = fVar171;
          auVar201._20_4_ = fVar171;
          auVar201._24_4_ = fVar171;
          auVar201._28_4_ = fVar171;
          uVar143 = vcmpps_avx512vl(auVar201,auVar113,2);
          fVar170 = (ray->super_RayK<1>).tfar;
          auVar32._4_4_ = fVar170;
          auVar32._0_4_ = fVar170;
          auVar32._8_4_ = fVar170;
          auVar32._12_4_ = fVar170;
          auVar32._16_4_ = fVar170;
          auVar32._20_4_ = fVar170;
          auVar32._24_4_ = fVar170;
          auVar32._28_4_ = fVar170;
          uVar25 = vcmpps_avx512vl(auVar113,auVar32,2);
          bVar82 = (byte)uVar143 & (byte)uVar25 & bVar82;
          if (bVar82 != 0) {
            uVar143 = vcmpps_avx512vl(auVar111,auVar112,4);
            if ((bVar82 & (byte)uVar143) != 0) {
              bVar82 = bVar82 & (byte)uVar143;
              fVar170 = auVar100._0_4_ * fVar178;
              fVar177 = auVar100._4_4_ * fVar186;
              auVar44._4_4_ = fVar177;
              auVar44._0_4_ = fVar170;
              fVar83 = auVar100._8_4_ * fVar187;
              auVar44._8_4_ = fVar83;
              fVar84 = auVar100._12_4_ * fVar188;
              auVar44._12_4_ = fVar84;
              fVar135 = auVar100._16_4_ * 0.0;
              auVar44._16_4_ = fVar135;
              fVar136 = auVar100._20_4_ * 0.0;
              auVar44._20_4_ = fVar136;
              fVar137 = auVar100._24_4_ * 0.0;
              auVar44._24_4_ = fVar137;
              auVar44._28_4_ = auVar100._28_4_;
              fVar178 = auVar102._0_4_ * fVar178;
              fVar186 = auVar102._4_4_ * fVar186;
              auVar45._4_4_ = fVar186;
              auVar45._0_4_ = fVar178;
              fVar187 = auVar102._8_4_ * fVar187;
              auVar45._8_4_ = fVar187;
              fVar188 = auVar102._12_4_ * fVar188;
              auVar45._12_4_ = fVar188;
              fVar138 = auVar102._16_4_ * 0.0;
              auVar45._16_4_ = fVar138;
              fVar139 = auVar102._20_4_ * 0.0;
              auVar45._20_4_ = fVar139;
              fVar140 = auVar102._24_4_ * 0.0;
              auVar45._24_4_ = fVar140;
              auVar45._28_4_ = auVar102._28_4_;
              auVar195._8_4_ = 0x3f800000;
              auVar195._0_8_ = &DAT_3f8000003f800000;
              auVar195._12_4_ = 0x3f800000;
              auVar195._16_4_ = 0x3f800000;
              auVar195._20_4_ = 0x3f800000;
              auVar195._24_4_ = 0x3f800000;
              auVar195._28_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar195,auVar44);
              local_3a0._0_4_ =
                   (uint)(bVar72 & 1) * (int)fVar170 | (uint)!(bool)(bVar72 & 1) * auVar111._0_4_;
              bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
              local_3a0._4_4_ = (uint)bVar12 * (int)fVar177 | (uint)!bVar12 * auVar111._4_4_;
              bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
              local_3a0._8_4_ = (uint)bVar12 * (int)fVar83 | (uint)!bVar12 * auVar111._8_4_;
              bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
              local_3a0._12_4_ = (uint)bVar12 * (int)fVar84 | (uint)!bVar12 * auVar111._12_4_;
              bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
              local_3a0._16_4_ = (uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar111._16_4_;
              bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
              local_3a0._20_4_ = (uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar111._20_4_;
              bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
              local_3a0._24_4_ = (uint)bVar12 * (int)fVar137 | (uint)!bVar12 * auVar111._24_4_;
              bVar12 = SUB81(uVar73 >> 7,0);
              local_3a0._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar111._28_4_;
              auVar111 = vsubps_avx(auVar195,auVar45);
              bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
              bVar18 = SUB81(uVar73 >> 7,0);
              local_1a0._4_4_ = (uint)bVar12 * (int)fVar186 | (uint)!bVar12 * auVar111._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar72 & 1) * (int)fVar178 | (uint)!(bool)(bVar72 & 1) * auVar111._0_4_;
              local_1a0._8_4_ = (uint)bVar13 * (int)fVar187 | (uint)!bVar13 * auVar111._8_4_;
              local_1a0._12_4_ = (uint)bVar14 * (int)fVar188 | (uint)!bVar14 * auVar111._12_4_;
              local_1a0._16_4_ = (uint)bVar15 * (int)fVar138 | (uint)!bVar15 * auVar111._16_4_;
              local_1a0._20_4_ = (uint)bVar16 * (int)fVar139 | (uint)!bVar16 * auVar111._20_4_;
              local_1a0._24_4_ = (uint)bVar17 * (int)fVar140 | (uint)!bVar17 * auVar111._24_4_;
              local_1a0._28_4_ = (uint)bVar18 * auVar102._28_4_ | (uint)!bVar18 * auVar111._28_4_;
              local_440 = auVar113;
              goto LAB_01c0b197;
            }
          }
          bVar82 = 0;
        }
LAB_01c0b197:
        auVar224 = ZEXT3264(local_4a0);
        auVar223 = ZEXT3264(local_480);
        auVar222 = ZEXT3264(local_460);
        auVar217 = ZEXT3264(auVar101);
        local_5b0 = auVar23;
        _local_510 = auVar24;
        if (bVar82 != 0) {
          auVar111 = vsubps_avx(ZEXT1632(auVar88),auVar104);
          auVar93 = vfmadd213ps_fma(auVar111,local_3a0,auVar104);
          fVar170 = local_5e8->depth_scale;
          auVar104._4_4_ = fVar170;
          auVar104._0_4_ = fVar170;
          auVar104._8_4_ = fVar170;
          auVar104._12_4_ = fVar170;
          auVar104._16_4_ = fVar170;
          auVar104._20_4_ = fVar170;
          auVar104._24_4_ = fVar170;
          auVar104._28_4_ = fVar170;
          auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                        CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                 CONCAT44(auVar93._4_4_ +
                                                                          auVar93._4_4_,
                                                                          auVar93._0_4_ +
                                                                          auVar93._0_4_)))),auVar104
                                    );
          uVar143 = vcmpps_avx512vl(local_440,auVar111,6);
          bVar82 = bVar82 & (byte)uVar143;
          if (bVar82 != 0) {
            auVar146._8_4_ = 0xbf800000;
            auVar146._0_8_ = 0xbf800000bf800000;
            auVar146._12_4_ = 0xbf800000;
            auVar146._16_4_ = 0xbf800000;
            auVar146._20_4_ = 0xbf800000;
            auVar146._24_4_ = 0xbf800000;
            auVar146._28_4_ = 0xbf800000;
            auVar33._8_4_ = 0x40000000;
            auVar33._0_8_ = 0x4000000040000000;
            auVar33._12_4_ = 0x40000000;
            auVar33._16_4_ = 0x40000000;
            auVar33._20_4_ = 0x40000000;
            auVar33._24_4_ = 0x40000000;
            auVar33._28_4_ = 0x40000000;
            local_1a0 = vfmadd132ps_avx512vl(local_1a0,auVar146,auVar33);
            local_2e0 = local_3a0;
            auVar111 = local_1a0;
            local_2c0 = local_1a0;
            local_2a0 = local_440;
            local_280 = 0;
            local_27c = iVar8;
            local_270 = local_5b0._0_8_;
            uStack_268 = local_5b0._8_8_;
            local_260 = local_4f0._0_8_;
            uStack_258 = local_4f0._8_8_;
            local_250 = local_500._0_8_;
            uStack_248 = local_500._8_8_;
            local_240 = local_510;
            uStack_238 = uStack_508;
            local_230 = bVar82;
            local_1a0 = auVar111;
            if ((pGVar78->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar170 = 1.0 / auVar105._0_4_;
              local_220[0] = fVar170 * (local_3a0._0_4_ + 0.0);
              local_220[1] = fVar170 * (local_3a0._4_4_ + 1.0);
              local_220[2] = fVar170 * (local_3a0._8_4_ + 2.0);
              local_220[3] = fVar170 * (local_3a0._12_4_ + 3.0);
              fStack_210 = fVar170 * (local_3a0._16_4_ + 4.0);
              fStack_20c = fVar170 * (local_3a0._20_4_ + 5.0);
              fStack_208 = fVar170 * (local_3a0._24_4_ + 6.0);
              fStack_204 = local_3a0._28_4_ + 7.0;
              local_200 = local_1a0._0_8_;
              uStack_1f8 = local_1a0._8_8_;
              uStack_1f0 = local_1a0._16_8_;
              uStack_1e8 = local_1a0._24_8_;
              local_1e0 = local_440;
              auVar147._8_4_ = 0x7f800000;
              auVar147._0_8_ = 0x7f8000007f800000;
              auVar147._12_4_ = 0x7f800000;
              auVar147._16_4_ = 0x7f800000;
              auVar147._20_4_ = 0x7f800000;
              auVar147._24_4_ = 0x7f800000;
              auVar147._28_4_ = 0x7f800000;
              auVar113 = vblendmps_avx512vl(auVar147,local_440);
              auVar122._0_4_ =
                   (uint)(bVar82 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar82 >> 1 & 1);
              auVar122._4_4_ = (uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar82 >> 2 & 1);
              auVar122._8_4_ = (uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar82 >> 3 & 1);
              auVar122._12_4_ = (uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar82 >> 4 & 1);
              auVar122._16_4_ = (uint)bVar12 * auVar113._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar82 >> 5 & 1);
              auVar122._20_4_ = (uint)bVar12 * auVar113._20_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar82 >> 6 & 1);
              auVar122._24_4_ = (uint)bVar12 * auVar113._24_4_ | (uint)!bVar12 * 0x7f800000;
              auVar122._28_4_ =
                   (uint)(bVar82 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
              auVar113 = vshufps_avx(auVar122,auVar122,0xb1);
              auVar113 = vminps_avx(auVar122,auVar113);
              auVar109 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar109);
              auVar109 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar109);
              uVar143 = vcmpps_avx512vl(auVar122,auVar113,0);
              bVar71 = (byte)uVar143 & bVar82;
              bVar72 = bVar82;
              if (bVar71 != 0) {
                bVar72 = bVar71;
              }
              uVar75 = 0;
              for (uVar74 = (uint)bVar72; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                uVar75 = uVar75 + 1;
              }
              uVar73 = (ulong)uVar75;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar170 = local_220[uVar73];
                fVar178 = *(float *)((long)&local_200 + uVar73 * 4);
                fVar187 = 1.0 - fVar170;
                fVar186 = fVar187 * fVar187 * -3.0;
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar187)),
                                          ZEXT416((uint)(fVar170 * fVar187)),ZEXT416(0xc0000000));
                auVar92 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar187)),
                                          ZEXT416((uint)(fVar170 * fVar170)),ZEXT416(0x40000000));
                fVar187 = auVar93._0_4_ * 3.0;
                fVar188 = auVar92._0_4_ * 3.0;
                fVar177 = fVar170 * fVar170 * 3.0;
                auVar191._0_4_ = fVar177 * (float)local_510._0_4_;
                auVar191._4_4_ = fVar177 * (float)local_510._4_4_;
                auVar191._8_4_ = fVar177 * (float)uStack_508;
                auVar191._12_4_ = fVar177 * uStack_508._4_4_;
                auVar162._4_4_ = fVar188;
                auVar162._0_4_ = fVar188;
                auVar162._8_4_ = fVar188;
                auVar162._12_4_ = fVar188;
                auVar93 = vfmadd132ps_fma(auVar162,auVar191,local_500);
                auVar172._4_4_ = fVar187;
                auVar172._0_4_ = fVar187;
                auVar172._8_4_ = fVar187;
                auVar172._12_4_ = fVar187;
                auVar93 = vfmadd132ps_fma(auVar172,auVar93,local_4f0);
                auVar163._4_4_ = fVar186;
                auVar163._0_4_ = fVar186;
                auVar163._8_4_ = fVar186;
                auVar163._12_4_ = fVar186;
                (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar73 * 4);
                auVar93 = vfmadd132ps_fma(auVar163,auVar93,local_5b0);
                uVar143 = vmovlps_avx(auVar93);
                *(undefined8 *)&(ray->Ng).field_0 = uVar143;
                fVar186 = (float)vextractps_avx(auVar93,2);
                (ray->Ng).field_0.field_0.z = fVar186;
                ray->u = fVar170;
                ray->v = fVar178;
                ray->primID = uVar76;
                ray->geomID = uVar80;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_400 = local_4f0._0_4_;
                uStack_3fc = local_4f0._4_4_;
                uStack_3f8 = local_4f0._8_8_;
                local_410 = local_500._0_8_;
                uStack_408 = local_500._8_8_;
                local_500 = auVar27;
                local_4f0 = auVar28;
                local_420 = (float)local_510._0_4_;
                fStack_41c = (float)local_510._4_4_;
                fStack_418 = (float)uStack_508;
                fStack_414 = uStack_508._4_4_;
                do {
                  _local_510 = auVar24;
                  auVar86 = auVar221._0_16_;
                  local_594 = local_220[uVar73];
                  local_590 = *(undefined4 *)((long)&local_200 + uVar73 * 4);
                  fVar179 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar73 * 4);
                  local_5e0.context = context->user;
                  fVar178 = 1.0 - local_594;
                  fVar170 = fVar178 * fVar178 * -3.0;
                  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar178)),
                                            ZEXT416((uint)(local_594 * fVar178)),ZEXT416(0xc0000000)
                                           );
                  auVar92 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar178)),
                                            ZEXT416((uint)(local_594 * local_594)),
                                            ZEXT416(0x40000000));
                  fVar178 = auVar93._0_4_ * 3.0;
                  fVar186 = auVar92._0_4_ * 3.0;
                  fVar187 = local_594 * local_594 * 3.0;
                  auVar194._0_4_ = fVar187 * local_420;
                  auVar194._4_4_ = fVar187 * fStack_41c;
                  auVar194._8_4_ = fVar187 * fStack_418;
                  auVar194._12_4_ = fVar187 * fStack_414;
                  auVar168._4_4_ = fVar186;
                  auVar168._0_4_ = fVar186;
                  auVar168._8_4_ = fVar186;
                  auVar168._12_4_ = fVar186;
                  auVar67._8_8_ = uStack_408;
                  auVar67._0_8_ = local_410;
                  auVar93 = vfmadd132ps_fma(auVar168,auVar194,auVar67);
                  auVar175._4_4_ = fVar178;
                  auVar175._0_4_ = fVar178;
                  auVar175._8_4_ = fVar178;
                  auVar175._12_4_ = fVar178;
                  auVar68._4_4_ = uStack_3fc;
                  auVar68._0_4_ = local_400;
                  auVar68._8_8_ = uStack_3f8;
                  auVar93 = vfmadd132ps_fma(auVar175,auVar93,auVar68);
                  auVar169._4_4_ = fVar170;
                  auVar169._0_4_ = fVar170;
                  auVar169._8_4_ = fVar170;
                  auVar169._12_4_ = fVar170;
                  auVar93 = vfmadd132ps_fma(auVar169,auVar93,local_5b0);
                  local_5a0 = vmovlps_avx(auVar93);
                  local_598 = vextractps_avx(auVar93,2);
                  local_58c = (int)local_5f0;
                  local_588 = (int)local_5f8;
                  local_584 = (local_5e0.context)->instID[0];
                  local_580 = (local_5e0.context)->instPrimID[0];
                  local_5fc = -1;
                  local_5e0.valid = &local_5fc;
                  local_5e0.geometryUserPtr = pGVar78->userPtr;
                  local_5e0.ray = (RTCRayN *)ray;
                  local_5e0.hit = (RTCHitN *)&local_5a0;
                  local_5e0.N = 1;
                  local_320 = (undefined4)uVar73;
                  uStack_31c = (undefined4)(uVar73 >> 0x20);
                  if (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c0c4a9:
                    auVar93 = auVar221._0_16_;
                    p_Var11 = context->args->filter;
                    if (p_Var11 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar78->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var11)(&local_5e0);
                        uVar73 = CONCAT44(uStack_31c,local_320);
                        auVar211 = ZEXT1664(_local_520);
                        auVar217 = ZEXT3264(local_3c0);
                        auVar224 = ZEXT3264(local_4a0);
                        auVar223 = ZEXT3264(local_480);
                        auVar222 = ZEXT3264(local_460);
                        auVar215 = ZEXT3264(local_560);
                        auVar216 = ZEXT3264(local_540);
                        auVar220 = ZEXT3264(local_380);
                        auVar219 = ZEXT3264(local_340);
                        auVar218 = ZEXT3264(local_360);
                        auVar93 = vxorps_avx512vl(auVar93,auVar93);
                        auVar221 = ZEXT1664(auVar93);
                        fVar171 = local_3e0;
                      }
                      if (*local_5e0.valid == 0) goto LAB_01c0c5b5;
                    }
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5e0.hit;
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5e0.hit + 4);
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5e0.hit + 8);
                    *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                    *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                    *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                    *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                    *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                    *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                  }
                  else {
                    (*pGVar78->intersectionFilterN)(&local_5e0);
                    uVar73 = CONCAT44(uStack_31c,local_320);
                    auVar211 = ZEXT1664(_local_520);
                    auVar217 = ZEXT3264(local_3c0);
                    auVar224 = ZEXT3264(local_4a0);
                    auVar223 = ZEXT3264(local_480);
                    auVar222 = ZEXT3264(local_460);
                    auVar215 = ZEXT3264(local_560);
                    auVar216 = ZEXT3264(local_540);
                    auVar220 = ZEXT3264(local_380);
                    auVar219 = ZEXT3264(local_340);
                    auVar218 = ZEXT3264(local_360);
                    auVar93 = vxorps_avx512vl(auVar86,auVar86);
                    auVar221 = ZEXT1664(auVar93);
                    fVar171 = local_3e0;
                    if (*local_5e0.valid != 0) goto LAB_01c0c4a9;
LAB_01c0c5b5:
                    (ray->super_RayK<1>).tfar = fVar179;
                  }
                  fVar179 = auVar211._0_4_;
                  auVar101 = auVar217._0_32_;
                  bVar72 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & bVar82;
                  fVar170 = (ray->super_RayK<1>).tfar;
                  auVar39._4_4_ = fVar170;
                  auVar39._0_4_ = fVar170;
                  auVar39._8_4_ = fVar170;
                  auVar39._12_4_ = fVar170;
                  auVar39._16_4_ = fVar170;
                  auVar39._20_4_ = fVar170;
                  auVar39._24_4_ = fVar170;
                  auVar39._28_4_ = fVar170;
                  uVar143 = vcmpps_avx512vl(local_440,auVar39,2);
                  bVar82 = bVar72 & (byte)uVar143;
                  if ((bVar72 & (byte)uVar143) != 0) {
                    auVar151._8_4_ = 0x7f800000;
                    auVar151._0_8_ = 0x7f8000007f800000;
                    auVar151._12_4_ = 0x7f800000;
                    auVar151._16_4_ = 0x7f800000;
                    auVar151._20_4_ = 0x7f800000;
                    auVar151._24_4_ = 0x7f800000;
                    auVar151._28_4_ = 0x7f800000;
                    auVar111 = vblendmps_avx512vl(auVar151,local_440);
                    auVar134._0_4_ =
                         (uint)(bVar82 & 1) * auVar111._0_4_ |
                         (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar82 >> 1 & 1);
                    auVar134._4_4_ = (uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar82 >> 2 & 1);
                    auVar134._8_4_ = (uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar82 >> 3 & 1);
                    auVar134._12_4_ = (uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar82 >> 4 & 1);
                    auVar134._16_4_ = (uint)bVar12 * auVar111._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar82 >> 5 & 1);
                    auVar134._20_4_ = (uint)bVar12 * auVar111._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar82 >> 6 & 1);
                    auVar134._24_4_ = (uint)bVar12 * auVar111._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar134._28_4_ =
                         (uint)(bVar82 >> 7) * auVar111._28_4_ |
                         (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                    auVar111 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar111 = vminps_avx(auVar134,auVar111);
                    auVar113 = vshufpd_avx(auVar111,auVar111,5);
                    auVar111 = vminps_avx(auVar111,auVar113);
                    auVar113 = vpermpd_avx2(auVar111,0x4e);
                    auVar111 = vminps_avx(auVar111,auVar113);
                    uVar143 = vcmpps_avx512vl(auVar134,auVar111,0);
                    bVar71 = (byte)uVar143 & bVar82;
                    bVar72 = bVar82;
                    if (bVar71 != 0) {
                      bVar72 = bVar71;
                    }
                    uVar80 = 0;
                    for (uVar76 = (uint)bVar72; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000
                        ) {
                      uVar80 = uVar80 + 1;
                    }
                    uVar73 = (ulong)uVar80;
                  }
                  auVar24 = _local_510;
                  auVar27 = local_500;
                  auVar28 = local_4f0;
                } while (bVar82 != 0);
              }
            }
          }
        }
      }
      local_4f0 = auVar28;
      local_500 = auVar27;
      if (8 < iVar8) {
        auVar111 = vpbroadcastd_avx512vl();
        auVar211 = ZEXT3264(auVar111);
        local_3e0 = fVar179;
        fStack_3dc = fVar179;
        fStack_3d8 = fVar179;
        fStack_3d4 = fVar179;
        fStack_3d0 = fVar179;
        fStack_3cc = fVar179;
        fStack_3c8 = fVar179;
        fStack_3c4 = fVar179;
        local_320 = fVar171;
        uStack_31c = fVar171;
        uStack_318 = fVar171;
        uStack_314 = fVar171;
        uStack_310 = fVar171;
        uStack_30c = fVar171;
        uStack_308 = fVar171;
        uStack_304 = fVar171;
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar79 = 8;
        local_3c0 = auVar101;
        do {
          auVar111 = vpbroadcastd_avx512vl();
          auVar96 = vpor_avx2(auVar111,_DAT_0205a920);
          uVar25 = vpcmpgtd_avx512vl(auVar211._0_32_,auVar96);
          auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 * 4 + lVar26);
          auVar113 = *(undefined1 (*) [32])(lVar26 + 0x2227768 + lVar79 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar26 + 0x2227bec + lVar79 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar26 + 0x2228070 + lVar79 * 4);
          local_480 = auVar223._0_32_;
          auVar97 = vmulps_avx512vl(local_480,auVar108);
          local_4a0 = auVar224._0_32_;
          auVar107 = vmulps_avx512vl(local_4a0,auVar108);
          auVar46._4_4_ = auVar108._4_4_ * (float)local_e0._4_4_;
          auVar46._0_4_ = auVar108._0_4_ * (float)local_e0._0_4_;
          auVar46._8_4_ = auVar108._8_4_ * fStack_d8;
          auVar46._12_4_ = auVar108._12_4_ * fStack_d4;
          auVar46._16_4_ = auVar108._16_4_ * fStack_d0;
          auVar46._20_4_ = auVar108._20_4_ * fStack_cc;
          auVar46._24_4_ = auVar108._24_4_ * fStack_c8;
          auVar46._28_4_ = auVar96._28_4_;
          auVar112 = auVar215._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar112);
          local_460 = auVar222._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar107,auVar109,local_460);
          auVar107 = vfmadd231ps_avx512vl(auVar46,auVar109,local_c0);
          auVar116 = auVar220._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar116);
          auVar114 = auVar216._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar113,auVar114);
          auVar93 = vfmadd231ps_fma(auVar107,auVar113,local_a0);
          auVar115 = auVar218._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar111,auVar115);
          local_340 = auVar219._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar97,auVar111,local_340);
          auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 * 4 + lVar26);
          auVar97 = *(undefined1 (*) [32])(lVar26 + 0x2229b88 + lVar79 * 4);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar111,local_80);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x222a00c + lVar79 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar26 + 0x222a490 + lVar79 * 4);
          auVar101 = vmulps_avx512vl(local_480,auVar98);
          auVar99 = vmulps_avx512vl(local_4a0,auVar98);
          auVar47._4_4_ = auVar98._4_4_ * (float)local_e0._4_4_;
          auVar47._0_4_ = auVar98._0_4_ * (float)local_e0._0_4_;
          auVar47._8_4_ = auVar98._8_4_ * fStack_d8;
          auVar47._12_4_ = auVar98._12_4_ * fStack_d4;
          auVar47._16_4_ = auVar98._16_4_ * fStack_d0;
          auVar47._20_4_ = auVar98._20_4_ * fStack_cc;
          auVar47._24_4_ = auVar98._24_4_ * fStack_c8;
          auVar47._28_4_ = uStack_c4;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar112);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_460);
          auVar103 = vfmadd231ps_avx512vl(auVar47,auVar107,local_c0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar116);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar114);
          auVar92 = vfmadd231ps_fma(auVar103,auVar97,local_a0);
          auVar103 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar115);
          auVar104 = vfmadd231ps_avx512vl(auVar99,auVar96,local_340);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar96,local_80);
          auVar105 = vmaxps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar92));
          auVar101 = vsubps_avx(auVar103,auVar100);
          auVar99 = vsubps_avx(auVar104,auVar102);
          auVar106 = vmulps_avx512vl(auVar102,auVar101);
          auVar110 = vmulps_avx512vl(auVar100,auVar99);
          auVar106 = vsubps_avx512vl(auVar106,auVar110);
          auVar110 = vmulps_avx512vl(auVar99,auVar99);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,auVar101);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar110);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          uVar143 = vcmpps_avx512vl(auVar106,auVar105,2);
          local_230 = (byte)uVar25 & (byte)uVar143;
          if (local_230 == 0) {
            auVar217 = ZEXT3264(auVar114);
            auVar215 = ZEXT3264(auVar112);
          }
          else {
            auVar98 = vmulps_avx512vl(local_3c0,auVar98);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar98);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar107);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_100,auVar97);
            auVar108 = vmulps_avx512vl(local_3c0,auVar108);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar108);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_120,auVar109);
            auVar97 = vfmadd213ps_avx512vl(auVar111,local_100,auVar113);
            auVar111 = *(undefined1 (*) [32])(lVar26 + 0x22284f4 + lVar79 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar26 + 0x2228978 + lVar79 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar26 + 0x2228dfc + lVar79 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar26 + 0x2229280 + lVar79 * 4);
            auVar107 = vmulps_avx512vl(local_480,auVar108);
            auVar98 = vmulps_avx512vl(local_4a0,auVar108);
            auVar108 = vmulps_avx512vl(local_3c0,auVar108);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar112);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,local_460);
            auVar109 = vfmadd231ps_avx512vl(auVar108,local_140,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar116);
            auVar107 = vfmadd231ps_avx512vl(auVar98,auVar113,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar115);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_340);
            auVar98 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
            auVar111 = *(undefined1 (*) [32])(lVar26 + 0x222a914 + lVar79 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar26 + 0x222b21c + lVar79 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar26 + 0x222b6a0 + lVar79 * 4);
            auVar105 = vmulps_avx512vl(local_480,auVar109);
            auVar106 = vmulps_avx512vl(local_4a0,auVar109);
            auVar109 = vmulps_avx512vl(local_3c0,auVar109);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar112);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_460);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_140,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar26 + 0x222ad98 + lVar79 * 4);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar116);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
            auVar109 = vfmadd231ps_avx512vl(auVar105,auVar111,auVar115);
            auVar105 = vfmadd231ps_avx512vl(auVar106,auVar111,local_340);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar108,auVar106);
            vandps_avx512vl(auVar107,auVar106);
            auVar111 = vmaxps_avx(auVar106,auVar106);
            vandps_avx512vl(auVar98,auVar106);
            auVar111 = vmaxps_avx(auVar111,auVar106);
            auVar69._4_4_ = fStack_3dc;
            auVar69._0_4_ = local_3e0;
            auVar69._8_4_ = fStack_3d8;
            auVar69._12_4_ = fStack_3d4;
            auVar69._16_4_ = fStack_3d0;
            auVar69._20_4_ = fStack_3cc;
            auVar69._24_4_ = fStack_3c8;
            auVar69._28_4_ = fStack_3c4;
            uVar73 = vcmpps_avx512vl(auVar111,auVar69,1);
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar123._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar108._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar108._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar108._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar108._12_4_);
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar108._16_4_);
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar108._20_4_);
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar108._24_4_);
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar123._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar108._28_4_;
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar124._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar107._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar107._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar107._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar107._12_4_);
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar107._16_4_);
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar107._20_4_);
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar107._24_4_);
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar124._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar107._28_4_;
            vandps_avx512vl(auVar109,auVar106);
            vandps_avx512vl(auVar105,auVar106);
            auVar111 = vmaxps_avx(auVar124,auVar124);
            vandps_avx512vl(auVar113,auVar106);
            auVar111 = vmaxps_avx(auVar111,auVar124);
            uVar73 = vcmpps_avx512vl(auVar111,auVar69,1);
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar125._0_4_ = (uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar109._0_4_;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar109._4_4_;
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar109._8_4_;
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar109._12_4_;
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar125._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar109._16_4_;
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar125._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar109._20_4_;
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar125._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar109._24_4_;
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar125._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar109._28_4_;
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar126._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar105._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar105._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar105._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar105._12_4_);
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar105._16_4_);
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar105._20_4_);
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar105._24_4_);
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar126._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar105._28_4_;
            auVar205._8_4_ = 0x80000000;
            auVar205._0_8_ = 0x8000000080000000;
            auVar205._12_4_ = 0x80000000;
            auVar205._16_4_ = 0x80000000;
            auVar205._20_4_ = 0x80000000;
            auVar205._24_4_ = 0x80000000;
            auVar205._28_4_ = 0x80000000;
            auVar111 = vxorps_avx512vl(auVar125,auVar205);
            auVar105 = auVar221._0_32_;
            auVar113 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar105);
            auVar86 = vfmadd231ps_fma(auVar113,auVar124,auVar124);
            auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
            auVar214._8_4_ = 0xbf000000;
            auVar214._0_8_ = 0xbf000000bf000000;
            auVar214._12_4_ = 0xbf000000;
            auVar214._16_4_ = 0xbf000000;
            auVar214._20_4_ = 0xbf000000;
            auVar214._24_4_ = 0xbf000000;
            auVar214._28_4_ = 0xbf000000;
            fVar171 = auVar113._0_4_;
            fVar179 = auVar113._4_4_;
            fVar170 = auVar113._8_4_;
            fVar178 = auVar113._12_4_;
            fVar186 = auVar113._16_4_;
            fVar187 = auVar113._20_4_;
            fVar188 = auVar113._24_4_;
            auVar48._4_4_ = fVar179 * fVar179 * fVar179 * auVar86._4_4_ * -0.5;
            auVar48._0_4_ = fVar171 * fVar171 * fVar171 * auVar86._0_4_ * -0.5;
            auVar48._8_4_ = fVar170 * fVar170 * fVar170 * auVar86._8_4_ * -0.5;
            auVar48._12_4_ = fVar178 * fVar178 * fVar178 * auVar86._12_4_ * -0.5;
            auVar48._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
            auVar48._20_4_ = fVar187 * fVar187 * fVar187 * -0.0;
            auVar48._24_4_ = fVar188 * fVar188 * fVar188 * -0.0;
            auVar48._28_4_ = auVar124._28_4_;
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar113 = vfmadd231ps_avx512vl(auVar48,auVar109,auVar113);
            auVar49._4_4_ = auVar124._4_4_ * auVar113._4_4_;
            auVar49._0_4_ = auVar124._0_4_ * auVar113._0_4_;
            auVar49._8_4_ = auVar124._8_4_ * auVar113._8_4_;
            auVar49._12_4_ = auVar124._12_4_ * auVar113._12_4_;
            auVar49._16_4_ = auVar124._16_4_ * auVar113._16_4_;
            auVar49._20_4_ = auVar124._20_4_ * auVar113._20_4_;
            auVar49._24_4_ = auVar124._24_4_ * auVar113._24_4_;
            auVar49._28_4_ = 0;
            auVar50._4_4_ = auVar113._4_4_ * -auVar123._4_4_;
            auVar50._0_4_ = auVar113._0_4_ * -auVar123._0_4_;
            auVar50._8_4_ = auVar113._8_4_ * -auVar123._8_4_;
            auVar50._12_4_ = auVar113._12_4_ * -auVar123._12_4_;
            auVar50._16_4_ = auVar113._16_4_ * -auVar123._16_4_;
            auVar50._20_4_ = auVar113._20_4_ * -auVar123._20_4_;
            auVar50._24_4_ = auVar113._24_4_ * -auVar123._24_4_;
            auVar50._28_4_ = auVar124._28_4_;
            auVar108 = vmulps_avx512vl(auVar113,auVar105);
            auVar113 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar105);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar126);
            auVar107 = vrsqrt14ps_avx512vl(auVar113);
            auVar113 = vmulps_avx512vl(auVar113,auVar214);
            fVar171 = auVar107._0_4_;
            fVar179 = auVar107._4_4_;
            fVar170 = auVar107._8_4_;
            fVar178 = auVar107._12_4_;
            fVar186 = auVar107._16_4_;
            fVar187 = auVar107._20_4_;
            fVar188 = auVar107._24_4_;
            auVar51._4_4_ = fVar179 * fVar179 * fVar179 * auVar113._4_4_;
            auVar51._0_4_ = fVar171 * fVar171 * fVar171 * auVar113._0_4_;
            auVar51._8_4_ = fVar170 * fVar170 * fVar170 * auVar113._8_4_;
            auVar51._12_4_ = fVar178 * fVar178 * fVar178 * auVar113._12_4_;
            auVar51._16_4_ = fVar186 * fVar186 * fVar186 * auVar113._16_4_;
            auVar51._20_4_ = fVar187 * fVar187 * fVar187 * auVar113._20_4_;
            auVar51._24_4_ = fVar188 * fVar188 * fVar188 * auVar113._24_4_;
            auVar51._28_4_ = auVar113._28_4_;
            auVar113 = vfmadd231ps_avx512vl(auVar51,auVar109,auVar107);
            auVar52._4_4_ = auVar126._4_4_ * auVar113._4_4_;
            auVar52._0_4_ = auVar126._0_4_ * auVar113._0_4_;
            auVar52._8_4_ = auVar126._8_4_ * auVar113._8_4_;
            auVar52._12_4_ = auVar126._12_4_ * auVar113._12_4_;
            auVar52._16_4_ = auVar126._16_4_ * auVar113._16_4_;
            auVar52._20_4_ = auVar126._20_4_ * auVar113._20_4_;
            auVar52._24_4_ = auVar126._24_4_ * auVar113._24_4_;
            auVar52._28_4_ = auVar107._28_4_;
            auVar53._4_4_ = auVar113._4_4_ * auVar111._4_4_;
            auVar53._0_4_ = auVar113._0_4_ * auVar111._0_4_;
            auVar53._8_4_ = auVar113._8_4_ * auVar111._8_4_;
            auVar53._12_4_ = auVar113._12_4_ * auVar111._12_4_;
            auVar53._16_4_ = auVar113._16_4_ * auVar111._16_4_;
            auVar53._20_4_ = auVar113._20_4_ * auVar111._20_4_;
            auVar53._24_4_ = auVar113._24_4_ * auVar111._24_4_;
            auVar53._28_4_ = auVar111._28_4_;
            auVar111 = vmulps_avx512vl(auVar113,auVar105);
            auVar86 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar93),auVar100);
            auVar113 = ZEXT1632(auVar93);
            auVar19 = vfmadd213ps_fma(auVar50,auVar113,auVar102);
            auVar109 = vfmadd213ps_avx512vl(auVar108,auVar113,auVar97);
            auVar107 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar92),auVar103);
            auVar88 = vfnmadd213ps_fma(auVar49,auVar113,auVar100);
            auVar98 = ZEXT1632(auVar92);
            auVar20 = vfmadd213ps_fma(auVar53,auVar98,auVar104);
            auVar23 = vfnmadd213ps_fma(auVar50,auVar113,auVar102);
            auVar87 = vfmadd213ps_fma(auVar111,auVar98,auVar96);
            auVar102 = ZEXT1632(auVar93);
            auVar28 = vfnmadd231ps_fma(auVar97,auVar102,auVar108);
            auVar24 = vfnmadd213ps_fma(auVar52,auVar98,auVar103);
            auVar27 = vfnmadd213ps_fma(auVar53,auVar98,auVar104);
            auVar85 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar92),auVar111);
            auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar88));
            auVar111 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar23));
            auVar113 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar28));
            auVar54._4_4_ = auVar111._4_4_ * auVar28._4_4_;
            auVar54._0_4_ = auVar111._0_4_ * auVar28._0_4_;
            auVar54._8_4_ = auVar111._8_4_ * auVar28._8_4_;
            auVar54._12_4_ = auVar111._12_4_ * auVar28._12_4_;
            auVar54._16_4_ = auVar111._16_4_ * 0.0;
            auVar54._20_4_ = auVar111._20_4_ * 0.0;
            auVar54._24_4_ = auVar111._24_4_ * 0.0;
            auVar54._28_4_ = auVar108._28_4_;
            auVar93 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar23),auVar113);
            auVar55._4_4_ = auVar113._4_4_ * auVar88._4_4_;
            auVar55._0_4_ = auVar113._0_4_ * auVar88._0_4_;
            auVar55._8_4_ = auVar113._8_4_ * auVar88._8_4_;
            auVar55._12_4_ = auVar113._12_4_ * auVar88._12_4_;
            auVar55._16_4_ = auVar113._16_4_ * 0.0;
            auVar55._20_4_ = auVar113._20_4_ * 0.0;
            auVar55._24_4_ = auVar113._24_4_ * 0.0;
            auVar55._28_4_ = auVar113._28_4_;
            auVar21 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar28),auVar96);
            auVar56._4_4_ = auVar23._4_4_ * auVar96._4_4_;
            auVar56._0_4_ = auVar23._0_4_ * auVar96._0_4_;
            auVar56._8_4_ = auVar23._8_4_ * auVar96._8_4_;
            auVar56._12_4_ = auVar23._12_4_ * auVar96._12_4_;
            auVar56._16_4_ = auVar96._16_4_ * 0.0;
            auVar56._20_4_ = auVar96._20_4_ * 0.0;
            auVar56._24_4_ = auVar96._24_4_ * 0.0;
            auVar56._28_4_ = auVar96._28_4_;
            auVar22 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar88),auVar111);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar105,ZEXT1632(auVar21));
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar93));
            uVar73 = vcmpps_avx512vl(auVar111,auVar105,2);
            bVar82 = (byte)uVar73;
            fVar84 = (float)((uint)(bVar82 & 1) * auVar86._0_4_ |
                            (uint)!(bool)(bVar82 & 1) * auVar24._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar136 = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar24._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar138 = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar24._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar140 = (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar24._12_4_);
            auVar98 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar84))));
            fVar135 = (float)((uint)(bVar82 & 1) * auVar19._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * auVar27._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar137 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar27._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar139 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar27._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar141 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar27._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar135))));
            auVar127._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar85._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar85._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar85._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar85._12_4_);
            fVar170 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar109._16_4_);
            auVar127._16_4_ = fVar170;
            fVar179 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar109._20_4_);
            auVar127._20_4_ = fVar179;
            fVar171 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar109._24_4_);
            auVar127._24_4_ = fVar171;
            iVar1 = (uint)(byte)(uVar73 >> 7) * auVar109._28_4_;
            auVar127._28_4_ = iVar1;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar107);
            auVar128._0_4_ =
                 (uint)(bVar82 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar93._0_4_;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar93._4_4_;
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar93._8_4_;
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar93._12_4_;
            auVar128._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar111._16_4_;
            auVar128._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar111._20_4_;
            auVar128._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar111._24_4_;
            auVar128._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar23),ZEXT1632(auVar20));
            auVar129._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar86._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar86._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar86._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar86._12_4_);
            fVar178 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar111._16_4_);
            auVar129._16_4_ = fVar178;
            fVar186 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar111._20_4_);
            auVar129._20_4_ = fVar186;
            fVar187 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar111._24_4_);
            auVar129._24_4_ = fVar187;
            auVar129._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar87));
            auVar130._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar19._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar19._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar19._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar19._12_4_);
            fVar177 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar111._16_4_);
            auVar130._16_4_ = fVar177;
            fVar83 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar111._20_4_);
            auVar130._20_4_ = fVar83;
            fVar188 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar111._24_4_);
            auVar130._24_4_ = fVar188;
            iVar2 = (uint)(byte)(uVar73 >> 7) * auVar111._28_4_;
            auVar130._28_4_ = iVar2;
            auVar131._0_4_ =
                 (uint)(bVar82 & 1) * (int)auVar88._0_4_ |
                 (uint)!(bool)(bVar82 & 1) * auVar107._0_4_;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar12 * (int)auVar88._4_4_ | (uint)!bVar12 * auVar107._4_4_;
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar12 * (int)auVar88._8_4_ | (uint)!bVar12 * auVar107._8_4_;
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar12 * (int)auVar88._12_4_ | (uint)!bVar12 * auVar107._12_4_;
            auVar131._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar107._16_4_;
            auVar131._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar107._20_4_;
            auVar131._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar107._24_4_;
            auVar131._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar107._28_4_;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar107 = vsubps_avx512vl(auVar131,auVar98);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar23._12_4_ |
                                                     (uint)!bVar16 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar23._8_4_ |
                                                              (uint)!bVar14 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar23._4_4_ |
                                                                       (uint)!bVar12 * auVar20._4_4_
                                                                       ,(uint)(bVar82 & 1) *
                                                                        (int)auVar23._0_4_ |
                                                                        (uint)!(bool)(bVar82 & 1) *
                                                                        auVar20._0_4_)))),auVar101);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar28._12_4_ |
                                                     (uint)!bVar17 * auVar87._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar28._8_4_ |
                                                              (uint)!bVar15 * auVar87._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar28._4_4_ |
                                                                       (uint)!bVar13 * auVar87._4_4_
                                                                       ,(uint)(bVar82 & 1) *
                                                                        (int)auVar28._0_4_ |
                                                                        (uint)!(bool)(bVar82 & 1) *
                                                                        auVar87._0_4_)))),auVar127);
            auVar108 = vsubps_avx(auVar98,auVar128);
            auVar96 = vsubps_avx(auVar101,auVar129);
            auVar97 = vsubps_avx(auVar127,auVar130);
            auVar57._4_4_ = auVar109._4_4_ * fVar136;
            auVar57._0_4_ = auVar109._0_4_ * fVar84;
            auVar57._8_4_ = auVar109._8_4_ * fVar138;
            auVar57._12_4_ = auVar109._12_4_ * fVar140;
            auVar57._16_4_ = auVar109._16_4_ * 0.0;
            auVar57._20_4_ = auVar109._20_4_ * 0.0;
            auVar57._24_4_ = auVar109._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar57,auVar127,auVar107);
            auVar176._0_4_ = fVar135 * auVar107._0_4_;
            auVar176._4_4_ = fVar137 * auVar107._4_4_;
            auVar176._8_4_ = fVar139 * auVar107._8_4_;
            auVar176._12_4_ = fVar141 * auVar107._12_4_;
            auVar176._16_4_ = auVar107._16_4_ * 0.0;
            auVar176._20_4_ = auVar107._20_4_ * 0.0;
            auVar176._24_4_ = auVar107._24_4_ * 0.0;
            auVar176._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar176,auVar98,auVar113);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar105,ZEXT1632(auVar93));
            auVar184._0_4_ = auVar113._0_4_ * auVar127._0_4_;
            auVar184._4_4_ = auVar113._4_4_ * auVar127._4_4_;
            auVar184._8_4_ = auVar113._8_4_ * auVar127._8_4_;
            auVar184._12_4_ = auVar113._12_4_ * auVar127._12_4_;
            auVar184._16_4_ = auVar113._16_4_ * fVar170;
            auVar184._20_4_ = auVar113._20_4_ * fVar179;
            auVar184._24_4_ = auVar113._24_4_ * fVar171;
            auVar184._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar184,auVar101,auVar109);
            auVar99 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar93));
            auVar111 = vmulps_avx512vl(auVar97,auVar128);
            auVar111 = vfmsub231ps_avx512vl(auVar111,auVar108,auVar130);
            auVar58._4_4_ = auVar96._4_4_ * auVar130._4_4_;
            auVar58._0_4_ = auVar96._0_4_ * auVar130._0_4_;
            auVar58._8_4_ = auVar96._8_4_ * auVar130._8_4_;
            auVar58._12_4_ = auVar96._12_4_ * auVar130._12_4_;
            auVar58._16_4_ = auVar96._16_4_ * fVar177;
            auVar58._20_4_ = auVar96._20_4_ * fVar83;
            auVar58._24_4_ = auVar96._24_4_ * fVar188;
            auVar58._28_4_ = iVar2;
            auVar93 = vfmsub231ps_fma(auVar58,auVar129,auVar97);
            auVar185._0_4_ = auVar129._0_4_ * auVar108._0_4_;
            auVar185._4_4_ = auVar129._4_4_ * auVar108._4_4_;
            auVar185._8_4_ = auVar129._8_4_ * auVar108._8_4_;
            auVar185._12_4_ = auVar129._12_4_ * auVar108._12_4_;
            auVar185._16_4_ = fVar178 * auVar108._16_4_;
            auVar185._20_4_ = fVar186 * auVar108._20_4_;
            auVar185._24_4_ = fVar187 * auVar108._24_4_;
            auVar185._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar185,auVar96,auVar128);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar105,auVar111);
            auVar100 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar93));
            auVar111 = vmaxps_avx(auVar99,auVar100);
            uVar143 = vcmpps_avx512vl(auVar111,auVar105,2);
            local_230 = local_230 & (byte)uVar143;
            if (local_230 == 0) {
LAB_01c0bde4:
              local_230 = 0;
            }
            else {
              auVar59._4_4_ = auVar97._4_4_ * auVar113._4_4_;
              auVar59._0_4_ = auVar97._0_4_ * auVar113._0_4_;
              auVar59._8_4_ = auVar97._8_4_ * auVar113._8_4_;
              auVar59._12_4_ = auVar97._12_4_ * auVar113._12_4_;
              auVar59._16_4_ = auVar97._16_4_ * auVar113._16_4_;
              auVar59._20_4_ = auVar97._20_4_ * auVar113._20_4_;
              auVar59._24_4_ = auVar97._24_4_ * auVar113._24_4_;
              auVar59._28_4_ = auVar111._28_4_;
              auVar19 = vfmsub231ps_fma(auVar59,auVar96,auVar109);
              auVar60._4_4_ = auVar109._4_4_ * auVar108._4_4_;
              auVar60._0_4_ = auVar109._0_4_ * auVar108._0_4_;
              auVar60._8_4_ = auVar109._8_4_ * auVar108._8_4_;
              auVar60._12_4_ = auVar109._12_4_ * auVar108._12_4_;
              auVar60._16_4_ = auVar109._16_4_ * auVar108._16_4_;
              auVar60._20_4_ = auVar109._20_4_ * auVar108._20_4_;
              auVar60._24_4_ = auVar109._24_4_ * auVar108._24_4_;
              auVar60._28_4_ = auVar109._28_4_;
              auVar86 = vfmsub231ps_fma(auVar60,auVar107,auVar97);
              auVar61._4_4_ = auVar96._4_4_ * auVar107._4_4_;
              auVar61._0_4_ = auVar96._0_4_ * auVar107._0_4_;
              auVar61._8_4_ = auVar96._8_4_ * auVar107._8_4_;
              auVar61._12_4_ = auVar96._12_4_ * auVar107._12_4_;
              auVar61._16_4_ = auVar96._16_4_ * auVar107._16_4_;
              auVar61._20_4_ = auVar96._20_4_ * auVar107._20_4_;
              auVar61._24_4_ = auVar96._24_4_ * auVar107._24_4_;
              auVar61._28_4_ = auVar96._28_4_;
              auVar20 = vfmsub231ps_fma(auVar61,auVar108,auVar113);
              auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar86),ZEXT1632(auVar20));
              auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar19),auVar105);
              auVar113 = vrcp14ps_avx512vl(auVar111);
              auVar34._8_4_ = 0x3f800000;
              auVar34._0_8_ = &DAT_3f8000003f800000;
              auVar34._12_4_ = 0x3f800000;
              auVar34._16_4_ = 0x3f800000;
              auVar34._20_4_ = 0x3f800000;
              auVar34._24_4_ = 0x3f800000;
              auVar34._28_4_ = 0x3f800000;
              auVar109 = vfnmadd213ps_avx512vl(auVar113,auVar111,auVar34);
              auVar93 = vfmadd132ps_fma(auVar109,auVar113,auVar113);
              auVar62._4_4_ = auVar20._4_4_ * auVar127._4_4_;
              auVar62._0_4_ = auVar20._0_4_ * auVar127._0_4_;
              auVar62._8_4_ = auVar20._8_4_ * auVar127._8_4_;
              auVar62._12_4_ = auVar20._12_4_ * auVar127._12_4_;
              auVar62._16_4_ = fVar170 * 0.0;
              auVar62._20_4_ = fVar179 * 0.0;
              auVar62._24_4_ = fVar171 * 0.0;
              auVar62._28_4_ = iVar1;
              auVar86 = vfmadd231ps_fma(auVar62,auVar101,ZEXT1632(auVar86));
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar98,ZEXT1632(auVar19));
              fVar179 = auVar93._0_4_;
              fVar170 = auVar93._4_4_;
              fVar178 = auVar93._8_4_;
              fVar186 = auVar93._12_4_;
              auVar113 = ZEXT1632(CONCAT412(auVar86._12_4_ * fVar186,
                                            CONCAT48(auVar86._8_4_ * fVar178,
                                                     CONCAT44(auVar86._4_4_ * fVar170,
                                                              auVar86._0_4_ * fVar179))));
              auVar70._4_4_ = uStack_31c;
              auVar70._0_4_ = local_320;
              auVar70._8_4_ = uStack_318;
              auVar70._12_4_ = uStack_314;
              auVar70._16_4_ = uStack_310;
              auVar70._20_4_ = uStack_30c;
              auVar70._24_4_ = uStack_308;
              auVar70._28_4_ = uStack_304;
              uVar143 = vcmpps_avx512vl(auVar113,auVar70,0xd);
              fVar171 = (ray->super_RayK<1>).tfar;
              auVar35._4_4_ = fVar171;
              auVar35._0_4_ = fVar171;
              auVar35._8_4_ = fVar171;
              auVar35._12_4_ = fVar171;
              auVar35._16_4_ = fVar171;
              auVar35._20_4_ = fVar171;
              auVar35._24_4_ = fVar171;
              auVar35._28_4_ = fVar171;
              uVar25 = vcmpps_avx512vl(auVar113,auVar35,2);
              local_230 = (byte)uVar143 & (byte)uVar25 & local_230;
              if (local_230 == 0) goto LAB_01c0bde4;
              uVar143 = vcmpps_avx512vl(auVar111,auVar105,4);
              if ((local_230 & (byte)uVar143) == 0) {
                local_230 = 0;
              }
              else {
                local_230 = local_230 & (byte)uVar143;
                fVar171 = auVar99._0_4_ * fVar179;
                fVar187 = auVar99._4_4_ * fVar170;
                auVar63._4_4_ = fVar187;
                auVar63._0_4_ = fVar171;
                fVar188 = auVar99._8_4_ * fVar178;
                auVar63._8_4_ = fVar188;
                fVar177 = auVar99._12_4_ * fVar186;
                auVar63._12_4_ = fVar177;
                fVar83 = auVar99._16_4_ * 0.0;
                auVar63._16_4_ = fVar83;
                fVar84 = auVar99._20_4_ * 0.0;
                auVar63._20_4_ = fVar84;
                fVar135 = auVar99._24_4_ * 0.0;
                auVar63._24_4_ = fVar135;
                auVar63._28_4_ = auVar99._28_4_;
                fVar179 = auVar100._0_4_ * fVar179;
                fVar170 = auVar100._4_4_ * fVar170;
                auVar64._4_4_ = fVar170;
                auVar64._0_4_ = fVar179;
                fVar178 = auVar100._8_4_ * fVar178;
                auVar64._8_4_ = fVar178;
                fVar186 = auVar100._12_4_ * fVar186;
                auVar64._12_4_ = fVar186;
                fVar136 = auVar100._16_4_ * 0.0;
                auVar64._16_4_ = fVar136;
                fVar137 = auVar100._20_4_ * 0.0;
                auVar64._20_4_ = fVar137;
                fVar138 = auVar100._24_4_ * 0.0;
                auVar64._24_4_ = fVar138;
                auVar64._28_4_ = auVar100._28_4_;
                auVar196._8_4_ = 0x3f800000;
                auVar196._0_8_ = &DAT_3f8000003f800000;
                auVar196._12_4_ = 0x3f800000;
                auVar196._16_4_ = 0x3f800000;
                auVar196._20_4_ = 0x3f800000;
                auVar196._24_4_ = 0x3f800000;
                auVar196._28_4_ = 0x3f800000;
                auVar111 = vsubps_avx(auVar196,auVar63);
                local_4c0._0_4_ =
                     (uint)(bVar82 & 1) * (int)fVar171 | (uint)!(bool)(bVar82 & 1) * auVar111._0_4_;
                bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                local_4c0._4_4_ = (uint)bVar12 * (int)fVar187 | (uint)!bVar12 * auVar111._4_4_;
                bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                local_4c0._8_4_ = (uint)bVar12 * (int)fVar188 | (uint)!bVar12 * auVar111._8_4_;
                bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                local_4c0._12_4_ = (uint)bVar12 * (int)fVar177 | (uint)!bVar12 * auVar111._12_4_;
                bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
                local_4c0._16_4_ = (uint)bVar12 * (int)fVar83 | (uint)!bVar12 * auVar111._16_4_;
                bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
                local_4c0._20_4_ = (uint)bVar12 * (int)fVar84 | (uint)!bVar12 * auVar111._20_4_;
                bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
                local_4c0._24_4_ = (uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar111._24_4_;
                bVar12 = SUB81(uVar73 >> 7,0);
                local_4c0._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar111._28_4_;
                auVar111 = vsubps_avx(auVar196,auVar64);
                bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
                bVar18 = SUB81(uVar73 >> 7,0);
                local_1c0._4_4_ = (uint)bVar12 * (int)fVar170 | (uint)!bVar12 * auVar111._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar82 & 1) * (int)fVar179 | (uint)!(bool)(bVar82 & 1) * auVar111._0_4_;
                local_1c0._8_4_ = (uint)bVar13 * (int)fVar178 | (uint)!bVar13 * auVar111._8_4_;
                local_1c0._12_4_ = (uint)bVar14 * (int)fVar186 | (uint)!bVar14 * auVar111._12_4_;
                local_1c0._16_4_ = (uint)bVar15 * (int)fVar136 | (uint)!bVar15 * auVar111._16_4_;
                local_1c0._20_4_ = (uint)bVar16 * (int)fVar137 | (uint)!bVar16 * auVar111._20_4_;
                local_1c0._24_4_ = (uint)bVar17 * (int)fVar138 | (uint)!bVar17 * auVar111._24_4_;
                local_1c0._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar111._28_4_;
                local_4e0 = auVar113;
              }
            }
            auVar217 = ZEXT3264(local_540);
            auVar215 = ZEXT3264(local_560);
            if (local_230 != 0) {
              auVar111 = vsubps_avx(ZEXT1632(auVar92),auVar102);
              auVar93 = vfmadd213ps_fma(auVar111,local_4c0,auVar102);
              fVar171 = local_5e8->depth_scale;
              auVar36._4_4_ = fVar171;
              auVar36._0_4_ = fVar171;
              auVar36._8_4_ = fVar171;
              auVar36._12_4_ = fVar171;
              auVar36._16_4_ = fVar171;
              auVar36._20_4_ = fVar171;
              auVar36._24_4_ = fVar171;
              auVar36._28_4_ = fVar171;
              auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                            CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                     CONCAT44(auVar93._4_4_ +
                                                                              auVar93._4_4_,
                                                                              auVar93._0_4_ +
                                                                              auVar93._0_4_)))),
                                         auVar36);
              uVar143 = vcmpps_avx512vl(local_4e0,auVar111,6);
              local_230 = local_230 & (byte)uVar143;
              uVar80 = (uint)local_230;
              if (local_230 != 0) {
                auVar148._8_4_ = 0xbf800000;
                auVar148._0_8_ = 0xbf800000bf800000;
                auVar148._12_4_ = 0xbf800000;
                auVar148._16_4_ = 0xbf800000;
                auVar148._20_4_ = 0xbf800000;
                auVar148._24_4_ = 0xbf800000;
                auVar148._28_4_ = 0xbf800000;
                auVar37._8_4_ = 0x40000000;
                auVar37._0_8_ = 0x4000000040000000;
                auVar37._12_4_ = 0x40000000;
                auVar37._16_4_ = 0x40000000;
                auVar37._20_4_ = 0x40000000;
                auVar37._24_4_ = 0x40000000;
                auVar37._28_4_ = 0x40000000;
                local_1c0 = vfmadd132ps_avx512vl(local_1c0,auVar148,auVar37);
                local_2e0 = local_4c0;
                auVar111 = local_1c0;
                local_2c0 = local_1c0;
                local_2a0 = local_4e0;
                local_280 = (int)lVar79;
                local_27c = iVar8;
                local_270 = local_5b0._0_8_;
                uStack_268 = local_5b0._8_8_;
                local_260 = local_4f0._0_8_;
                uStack_258 = local_4f0._8_8_;
                local_250 = local_500._0_8_;
                uStack_248 = local_500._8_8_;
                local_240 = local_510;
                uStack_238 = uStack_508;
                pGVar78 = (context->scene->geometries).items[local_5f8].ptr;
                local_1c0 = auVar111;
                if ((pGVar78->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar93 = vcvtsi2ss_avx512f(auVar216._0_16_,(int)lVar79);
                  fVar171 = auVar93._0_4_;
                  local_220[0] = (fVar171 + local_4c0._0_4_ + 0.0) * (float)local_300._0_4_;
                  local_220[1] = (fVar171 + local_4c0._4_4_ + 1.0) * (float)local_300._4_4_;
                  local_220[2] = (fVar171 + local_4c0._8_4_ + 2.0) * fStack_2f8;
                  local_220[3] = (fVar171 + local_4c0._12_4_ + 3.0) * fStack_2f4;
                  fStack_210 = (fVar171 + local_4c0._16_4_ + 4.0) * fStack_2f0;
                  fStack_20c = (fVar171 + local_4c0._20_4_ + 5.0) * fStack_2ec;
                  fStack_208 = (fVar171 + local_4c0._24_4_ + 6.0) * fStack_2e8;
                  fStack_204 = fVar171 + local_4c0._28_4_ + 7.0;
                  local_200 = local_1c0._0_8_;
                  uStack_1f8 = local_1c0._8_8_;
                  uStack_1f0 = local_1c0._16_8_;
                  uStack_1e8 = local_1c0._24_8_;
                  local_1e0 = local_4e0;
                  auVar149._8_4_ = 0x7f800000;
                  auVar149._0_8_ = 0x7f8000007f800000;
                  auVar149._12_4_ = 0x7f800000;
                  auVar149._16_4_ = 0x7f800000;
                  auVar149._20_4_ = 0x7f800000;
                  auVar149._24_4_ = 0x7f800000;
                  auVar149._28_4_ = 0x7f800000;
                  auVar113 = vblendmps_avx512vl(auVar149,local_4e0);
                  auVar132._0_4_ =
                       (uint)(local_230 & 1) * auVar113._0_4_ |
                       (uint)!(bool)(local_230 & 1) * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 1 & 1);
                  auVar132._4_4_ = (uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 2 & 1);
                  auVar132._8_4_ = (uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 3 & 1);
                  auVar132._12_4_ = (uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 4 & 1);
                  auVar132._16_4_ = (uint)bVar12 * auVar113._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 5 & 1);
                  auVar132._20_4_ = (uint)bVar12 * auVar113._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 6 & 1);
                  auVar132._24_4_ = (uint)bVar12 * auVar113._24_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar132._28_4_ =
                       (uint)(local_230 >> 7) * auVar113._28_4_ |
                       (uint)!(bool)(local_230 >> 7) * 0x7f800000;
                  auVar113 = vshufps_avx(auVar132,auVar132,0xb1);
                  auVar113 = vminps_avx(auVar132,auVar113);
                  auVar109 = vshufpd_avx(auVar113,auVar113,5);
                  auVar113 = vminps_avx(auVar113,auVar109);
                  auVar109 = vpermpd_avx2(auVar113,0x4e);
                  auVar113 = vminps_avx(auVar113,auVar109);
                  uVar143 = vcmpps_avx512vl(auVar132,auVar113,0);
                  bVar72 = (byte)uVar143 & local_230;
                  bVar82 = local_230;
                  if (bVar72 != 0) {
                    bVar82 = bVar72;
                  }
                  uVar76 = 0;
                  for (uVar75 = (uint)bVar82; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000)
                  {
                    uVar76 = uVar76 + 1;
                  }
                  uVar73 = (ulong)uVar76;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar171 = local_220[uVar73];
                    fVar179 = *(float *)((long)&local_200 + uVar73 * 4);
                    fVar178 = 1.0 - fVar171;
                    fVar170 = fVar178 * fVar178 * -3.0;
                    auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar178)),
                                              ZEXT416((uint)(fVar171 * fVar178)),ZEXT416(0xc0000000)
                                             );
                    auVar92 = vfmsub132ss_fma(ZEXT416((uint)(fVar171 * fVar178)),
                                              ZEXT416((uint)(fVar171 * fVar171)),ZEXT416(0x40000000)
                                             );
                    fVar178 = auVar93._0_4_ * 3.0;
                    fVar186 = auVar92._0_4_ * 3.0;
                    fVar187 = fVar171 * fVar171 * 3.0;
                    auVar192._0_4_ = fVar187 * (float)local_510._0_4_;
                    auVar192._4_4_ = fVar187 * (float)local_510._4_4_;
                    auVar192._8_4_ = fVar187 * (float)uStack_508;
                    auVar192._12_4_ = fVar187 * uStack_508._4_4_;
                    auVar164._4_4_ = fVar186;
                    auVar164._0_4_ = fVar186;
                    auVar164._8_4_ = fVar186;
                    auVar164._12_4_ = fVar186;
                    auVar93 = vfmadd132ps_fma(auVar164,auVar192,local_500);
                    auVar173._4_4_ = fVar178;
                    auVar173._0_4_ = fVar178;
                    auVar173._8_4_ = fVar178;
                    auVar173._12_4_ = fVar178;
                    auVar93 = vfmadd132ps_fma(auVar173,auVar93,local_4f0);
                    auVar165._4_4_ = fVar170;
                    auVar165._0_4_ = fVar170;
                    auVar165._8_4_ = fVar170;
                    auVar165._12_4_ = fVar170;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar73 * 4);
                    auVar93 = vfmadd132ps_fma(auVar165,auVar93,local_5b0);
                    uVar143 = vmovlps_avx(auVar93);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar143;
                    fVar170 = (float)vextractps_avx(auVar93,2);
                    (ray->Ng).field_0.field_0.z = fVar170;
                    ray->u = fVar171;
                    ray->v = fVar179;
                    ray->primID = (uint)local_5f0;
                    ray->geomID = (uint)local_5f8;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_410 = local_4f0._0_8_;
                    uStack_408 = local_4f0._8_8_;
                    local_420 = local_500._0_4_;
                    fStack_41c = local_500._4_4_;
                    fStack_418 = local_500._8_4_;
                    fStack_414 = local_500._12_4_;
                    _local_520 = _local_510;
                    local_568 = pGVar78;
                    local_160 = vmovdqa64_avx512vl(auVar211._0_32_);
                    do {
                      auVar86 = auVar221._0_16_;
                      local_594 = local_220[uVar73];
                      local_590 = *(undefined4 *)((long)&local_200 + uVar73 * 4);
                      local_400 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar73 * 4);
                      local_5e0.context = context->user;
                      fVar179 = 1.0 - local_594;
                      fVar171 = fVar179 * fVar179 * -3.0;
                      auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                                ZEXT416((uint)(local_594 * fVar179)),
                                                ZEXT416(0xc0000000));
                      auVar92 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar179)),
                                                ZEXT416((uint)(local_594 * local_594)),
                                                ZEXT416(0x40000000));
                      fVar179 = auVar93._0_4_ * 3.0;
                      fVar170 = auVar92._0_4_ * 3.0;
                      fVar178 = local_594 * local_594 * 3.0;
                      auVar193._0_4_ = fVar178 * (float)local_520._0_4_;
                      auVar193._4_4_ = fVar178 * (float)local_520._4_4_;
                      auVar193._8_4_ = fVar178 * fStack_518;
                      auVar193._12_4_ = fVar178 * fStack_514;
                      auVar166._4_4_ = fVar170;
                      auVar166._0_4_ = fVar170;
                      auVar166._8_4_ = fVar170;
                      auVar166._12_4_ = fVar170;
                      auVar65._4_4_ = fStack_41c;
                      auVar65._0_4_ = local_420;
                      auVar65._8_4_ = fStack_418;
                      auVar65._12_4_ = fStack_414;
                      auVar93 = vfmadd132ps_fma(auVar166,auVar193,auVar65);
                      auVar174._4_4_ = fVar179;
                      auVar174._0_4_ = fVar179;
                      auVar174._8_4_ = fVar179;
                      auVar174._12_4_ = fVar179;
                      auVar66._8_8_ = uStack_408;
                      auVar66._0_8_ = local_410;
                      auVar93 = vfmadd132ps_fma(auVar174,auVar93,auVar66);
                      auVar167._4_4_ = fVar171;
                      auVar167._0_4_ = fVar171;
                      auVar167._8_4_ = fVar171;
                      auVar167._12_4_ = fVar171;
                      auVar93 = vfmadd132ps_fma(auVar167,auVar93,local_5b0);
                      local_5a0 = vmovlps_avx(auVar93);
                      local_598 = vextractps_avx(auVar93,2);
                      local_58c = (int)local_5f0;
                      local_588 = (int)local_5f8;
                      local_584 = (local_5e0.context)->instID[0];
                      local_580 = (local_5e0.context)->instPrimID[0];
                      local_5fc = -1;
                      local_5e0.valid = &local_5fc;
                      local_5e0.geometryUserPtr = pGVar78->userPtr;
                      local_5e0.ray = (RTCRayN *)ray;
                      local_5e0.hit = (RTCHitN *)&local_5a0;
                      local_5e0.N = 1;
                      if (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c0c070:
                        auVar93 = auVar221._0_16_;
                        p_Var11 = context->args->filter;
                        if (p_Var11 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar78->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_5e0);
                            auVar111 = vmovdqa64_avx512vl(local_160);
                            auVar211 = ZEXT3264(auVar111);
                            auVar224 = ZEXT3264(local_4a0);
                            auVar223 = ZEXT3264(local_480);
                            auVar222 = ZEXT3264(local_460);
                            auVar215 = ZEXT3264(local_560);
                            auVar217 = ZEXT3264(local_540);
                            auVar220 = ZEXT3264(local_380);
                            auVar219 = ZEXT3264(local_340);
                            auVar218 = ZEXT3264(local_360);
                            auVar93 = vxorps_avx512vl(auVar93,auVar93);
                            auVar221 = ZEXT1664(auVar93);
                            pGVar78 = local_568;
                          }
                          if (*local_5e0.valid == 0) goto LAB_01c0c169;
                        }
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5e0.hit;
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5e0.hit + 4);
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5e0.hit + 8);
                        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                      }
                      else {
                        (*pGVar78->intersectionFilterN)(&local_5e0);
                        auVar111 = vmovdqa64_avx512vl(local_160);
                        auVar211 = ZEXT3264(auVar111);
                        auVar224 = ZEXT3264(local_4a0);
                        auVar223 = ZEXT3264(local_480);
                        auVar222 = ZEXT3264(local_460);
                        auVar215 = ZEXT3264(local_560);
                        auVar217 = ZEXT3264(local_540);
                        auVar220 = ZEXT3264(local_380);
                        auVar219 = ZEXT3264(local_340);
                        auVar218 = ZEXT3264(local_360);
                        auVar93 = vxorps_avx512vl(auVar86,auVar86);
                        auVar221 = ZEXT1664(auVar93);
                        pGVar78 = local_568;
                        if (*local_5e0.valid != 0) goto LAB_01c0c070;
LAB_01c0c169:
                        (ray->super_RayK<1>).tfar = local_400;
                      }
                      bVar72 = ~(byte)(1 << ((uint)uVar73 & 0x1f)) & (byte)uVar80;
                      fVar171 = (ray->super_RayK<1>).tfar;
                      auVar38._4_4_ = fVar171;
                      auVar38._0_4_ = fVar171;
                      auVar38._8_4_ = fVar171;
                      auVar38._12_4_ = fVar171;
                      auVar38._16_4_ = fVar171;
                      auVar38._20_4_ = fVar171;
                      auVar38._24_4_ = fVar171;
                      auVar38._28_4_ = fVar171;
                      uVar143 = vcmpps_avx512vl(local_4e0,auVar38,2);
                      bVar82 = bVar72 & (byte)uVar143;
                      uVar80 = (uint)bVar82;
                      if ((bVar72 & (byte)uVar143) != 0) {
                        auVar150._8_4_ = 0x7f800000;
                        auVar150._0_8_ = 0x7f8000007f800000;
                        auVar150._12_4_ = 0x7f800000;
                        auVar150._16_4_ = 0x7f800000;
                        auVar150._20_4_ = 0x7f800000;
                        auVar150._24_4_ = 0x7f800000;
                        auVar150._28_4_ = 0x7f800000;
                        auVar111 = vblendmps_avx512vl(auVar150,local_4e0);
                        auVar133._0_4_ =
                             (uint)(bVar82 & 1) * auVar111._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar82 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar82 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar82 >> 3 & 1);
                        auVar133._12_4_ =
                             (uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar82 >> 4 & 1);
                        auVar133._16_4_ =
                             (uint)bVar12 * auVar111._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar82 >> 5 & 1);
                        auVar133._20_4_ =
                             (uint)bVar12 * auVar111._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar82 >> 6 & 1);
                        auVar133._24_4_ =
                             (uint)bVar12 * auVar111._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar133._28_4_ =
                             (uint)(bVar82 >> 7) * auVar111._28_4_ |
                             (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                        auVar111 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar111 = vminps_avx(auVar133,auVar111);
                        auVar113 = vshufpd_avx(auVar111,auVar111,5);
                        auVar111 = vminps_avx(auVar111,auVar113);
                        auVar113 = vpermpd_avx2(auVar111,0x4e);
                        auVar111 = vminps_avx(auVar111,auVar113);
                        uVar143 = vcmpps_avx512vl(auVar133,auVar111,0);
                        bVar72 = (byte)uVar143 & bVar82;
                        uVar76 = uVar80;
                        if (bVar72 != 0) {
                          uVar76 = (uint)bVar72;
                        }
                        uVar75 = 0;
                        for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                          uVar75 = uVar75 + 1;
                        }
                        uVar73 = (ulong)uVar75;
                      }
                    } while (bVar82 != 0);
                  }
                }
              }
            }
          }
          lVar79 = lVar79 + 8;
          auVar216 = auVar217;
        } while ((int)lVar79 < iVar8);
      }
      fVar171 = (ray->super_RayK<1>).tfar;
      auVar30._4_4_ = fVar171;
      auVar30._0_4_ = fVar171;
      auVar30._8_4_ = fVar171;
      auVar30._12_4_ = fVar171;
      uVar143 = vcmpps_avx512vl(local_170,auVar30,2);
      uVar80 = (uint)uVar81 & (uint)uVar81 + 0xf & (uint)uVar143;
      uVar81 = (ulong)uVar80;
    } while (uVar80 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }